

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<4,16>::
     occluded_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  undefined4 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  Primitive PVar7;
  int iVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  RTCFilterFunctionN p_Var13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  ulong uVar71;
  RayK<16> *pRVar72;
  byte bVar73;
  long lVar74;
  ulong uVar75;
  ulong uVar76;
  bool bVar77;
  uint uVar78;
  Geometry *geometry;
  long lVar79;
  ulong uVar80;
  float fVar81;
  float fVar82;
  float fVar128;
  float fVar130;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar129;
  float fVar131;
  float fVar133;
  float fVar134;
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar132;
  float fVar135;
  float fVar136;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined4 uVar137;
  undefined8 uVar138;
  vint4 bi_2;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  vint4 bi_1;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  vint4 bi;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar160;
  float fVar166;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  float fVar167;
  float fVar174;
  float fVar175;
  vint4 ai_2;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  float fVar176;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  vint4 ai_1;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  vint4 ai;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined4 uVar198;
  undefined1 auVar199 [16];
  undefined1 auVar200 [64];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  undefined1 auVar205 [64];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [16];
  undefined1 auVar209 [64];
  undefined1 auVar210 [64];
  undefined1 auVar211 [64];
  undefined1 auVar212 [64];
  undefined1 auVar213 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_8> bhit;
  vint<16> mask;
  bool local_9e1;
  RTCFilterFunctionNArguments local_9a0;
  undefined1 local_970 [8];
  float fStack_968;
  float fStack_964;
  undefined4 local_960;
  undefined4 uStack_95c;
  undefined8 uStack_958;
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  float local_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  LinearSpace3fa *local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined4 local_880;
  undefined4 uStack_87c;
  undefined4 uStack_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined8 local_700;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined4 local_680;
  int local_67c;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  byte local_630;
  float local_620 [4];
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [64];
  uint local_580;
  undefined4 uStack_57c;
  undefined4 uStack_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined4 uStack_568;
  undefined4 uStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  PVar7 = prim[1];
  uVar71 = (ulong)(byte)PVar7;
  lVar27 = uVar71 * 0x25;
  fVar167 = *(float *)(prim + lVar27 + 0x12);
  auVar87 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar87 = vsubps_avx(auVar87,*(undefined1 (*) [16])(prim + lVar27 + 6));
  auVar161._0_4_ = fVar167 * auVar87._0_4_;
  auVar161._4_4_ = fVar167 * auVar87._4_4_;
  auVar161._8_4_ = fVar167 * auVar87._8_4_;
  auVar161._12_4_ = fVar167 * auVar87._12_4_;
  auVar87 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 4 + 6)));
  auVar139._0_4_ = fVar167 * auVar86._0_4_;
  auVar139._4_4_ = fVar167 * auVar86._4_4_;
  auVar139._8_4_ = fVar167 * auVar86._8_4_;
  auVar139._12_4_ = fVar167 * auVar86._12_4_;
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar86 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 5 + 6)));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 6 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0xf + 6)));
  auVar208 = vcvtdq2ps_avx(auVar208);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar7 * 0x10 + uVar71 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x1a + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x1b + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar71 * 0x1c + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar177._4_4_ = auVar139._0_4_;
  auVar177._0_4_ = auVar139._0_4_;
  auVar177._8_4_ = auVar139._0_4_;
  auVar177._12_4_ = auVar139._0_4_;
  auVar88 = vshufps_avx(auVar139,auVar139,0x55);
  auVar89 = vshufps_avx(auVar139,auVar139,0xaa);
  fVar167 = auVar89._0_4_;
  auVar155._0_4_ = fVar167 * auVar208._0_4_;
  fVar174 = auVar89._4_4_;
  auVar155._4_4_ = fVar174 * auVar208._4_4_;
  fVar175 = auVar89._8_4_;
  auVar155._8_4_ = fVar175 * auVar208._8_4_;
  fVar176 = auVar89._12_4_;
  auVar155._12_4_ = fVar176 * auVar208._12_4_;
  auVar150._0_4_ = auVar22._0_4_ * fVar167;
  auVar150._4_4_ = auVar22._4_4_ * fVar174;
  auVar150._8_4_ = auVar22._8_4_ * fVar175;
  auVar150._12_4_ = auVar22._12_4_ * fVar176;
  auVar140._0_4_ = auVar25._0_4_ * fVar167;
  auVar140._4_4_ = auVar25._4_4_ * fVar174;
  auVar140._8_4_ = auVar25._8_4_ * fVar175;
  auVar140._12_4_ = auVar25._12_4_ * fVar176;
  auVar89 = vfmadd231ps_fma(auVar155,auVar88,auVar86);
  auVar29 = vfmadd231ps_fma(auVar150,auVar88,auVar21);
  auVar88 = vfmadd231ps_fma(auVar140,auVar24,auVar88);
  auVar90 = vfmadd231ps_fma(auVar89,auVar177,auVar87);
  auVar29 = vfmadd231ps_fma(auVar29,auVar177,auVar20);
  auVar30 = vfmadd231ps_fma(auVar88,auVar23,auVar177);
  auVar199._4_4_ = auVar161._0_4_;
  auVar199._0_4_ = auVar161._0_4_;
  auVar199._8_4_ = auVar161._0_4_;
  auVar199._12_4_ = auVar161._0_4_;
  auVar88 = vshufps_avx(auVar161,auVar161,0x55);
  auVar89 = vshufps_avx(auVar161,auVar161,0xaa);
  fVar167 = auVar89._0_4_;
  auVar178._0_4_ = fVar167 * auVar208._0_4_;
  fVar174 = auVar89._4_4_;
  auVar178._4_4_ = fVar174 * auVar208._4_4_;
  fVar175 = auVar89._8_4_;
  auVar178._8_4_ = fVar175 * auVar208._8_4_;
  fVar176 = auVar89._12_4_;
  auVar178._12_4_ = fVar176 * auVar208._12_4_;
  auVar168._0_4_ = auVar22._0_4_ * fVar167;
  auVar168._4_4_ = auVar22._4_4_ * fVar174;
  auVar168._8_4_ = auVar22._8_4_ * fVar175;
  auVar168._12_4_ = auVar22._12_4_ * fVar176;
  auVar162._0_4_ = auVar25._0_4_ * fVar167;
  auVar162._4_4_ = auVar25._4_4_ * fVar174;
  auVar162._8_4_ = auVar25._8_4_ * fVar175;
  auVar162._12_4_ = auVar25._12_4_ * fVar176;
  auVar86 = vfmadd231ps_fma(auVar178,auVar88,auVar86);
  auVar208 = vfmadd231ps_fma(auVar168,auVar88,auVar21);
  auVar21 = vfmadd231ps_fma(auVar162,auVar88,auVar24);
  auVar31 = vfmadd231ps_fma(auVar86,auVar199,auVar87);
  auVar139 = vfmadd231ps_fma(auVar208,auVar199,auVar20);
  auVar189._8_4_ = 0x7fffffff;
  auVar189._0_8_ = 0x7fffffff7fffffff;
  auVar189._12_4_ = 0x7fffffff;
  auVar140 = vfmadd231ps_fma(auVar21,auVar199,auVar23);
  auVar87 = vandps_avx(auVar189,auVar90);
  auVar186._8_4_ = 0x219392ef;
  auVar186._0_8_ = 0x219392ef219392ef;
  auVar186._12_4_ = 0x219392ef;
  uVar80 = vcmpps_avx512vl(auVar87,auVar186,1);
  bVar77 = (bool)((byte)uVar80 & 1);
  auVar83._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar90._0_4_;
  bVar77 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar90._4_4_;
  bVar77 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar90._8_4_;
  bVar77 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar90._12_4_;
  auVar87 = vandps_avx(auVar189,auVar29);
  uVar80 = vcmpps_avx512vl(auVar87,auVar186,1);
  bVar77 = (bool)((byte)uVar80 & 1);
  auVar84._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar29._0_4_;
  bVar77 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar84._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar29._4_4_;
  bVar77 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar84._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar29._8_4_;
  bVar77 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar84._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar29._12_4_;
  auVar87 = vandps_avx(auVar189,auVar30);
  uVar80 = vcmpps_avx512vl(auVar87,auVar186,1);
  bVar77 = (bool)((byte)uVar80 & 1);
  auVar85._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar30._0_4_;
  bVar77 = (bool)((byte)(uVar80 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar30._4_4_;
  bVar77 = (bool)((byte)(uVar80 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar30._8_4_;
  bVar77 = (bool)((byte)(uVar80 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar30._12_4_;
  auVar86 = vrcp14ps_avx512vl(auVar83);
  auVar187._8_4_ = 0x3f800000;
  auVar187._0_8_ = &DAT_3f8000003f800000;
  auVar187._12_4_ = 0x3f800000;
  auVar87 = vfnmadd213ps_fma(auVar83,auVar86,auVar187);
  auVar90 = vfmadd132ps_fma(auVar87,auVar86,auVar86);
  auVar86 = vrcp14ps_avx512vl(auVar84);
  auVar87 = vfnmadd213ps_fma(auVar84,auVar86,auVar187);
  auVar30 = vfmadd132ps_fma(auVar87,auVar86,auVar86);
  auVar86 = vrcp14ps_avx512vl(auVar85);
  auVar87 = vfnmadd213ps_fma(auVar85,auVar86,auVar187);
  auVar28 = vfmadd132ps_fma(auVar87,auVar86,auVar86);
  fVar167 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar27 + 0x16)) *
            *(float *)(prim + lVar27 + 0x1a);
  auVar184._4_4_ = fVar167;
  auVar184._0_4_ = fVar167;
  auVar184._8_4_ = fVar167;
  auVar184._12_4_ = fVar167;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = *(ulong *)(prim + uVar71 * 7 + 6);
  auVar87 = vpmovsxwd_avx(auVar87);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar71 * 0xb + 6);
  auVar86 = vpmovsxwd_avx(auVar86);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar20 = vsubps_avx(auVar86,auVar87);
  auVar208._8_8_ = 0;
  auVar208._0_8_ = *(ulong *)(prim + uVar71 * 9 + 6);
  auVar86 = vpmovsxwd_avx(auVar208);
  auVar208 = vfmadd213ps_fma(auVar20,auVar184,auVar87);
  auVar87 = vcvtdq2ps_avx(auVar86);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar71 * 0xd + 6);
  auVar86 = vpmovsxwd_avx(auVar20);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,auVar87);
  auVar20 = vfmadd213ps_fma(auVar86,auVar184,auVar87);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar71 * 0x12 + 6);
  auVar87 = vpmovsxwd_avx(auVar21);
  auVar87 = vcvtdq2ps_avx(auVar87);
  uVar80 = (ulong)(uint)((int)(uVar71 * 5) << 2);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar71 * 2 + uVar80 + 6);
  auVar86 = vpmovsxwd_avx(auVar22);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,auVar87);
  auVar21 = vfmadd213ps_fma(auVar86,auVar184,auVar87);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar80 + 6);
  auVar87 = vpmovsxwd_avx(auVar23);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar71 * 0x18 + 6);
  auVar86 = vpmovsxwd_avx(auVar24);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,auVar87);
  auVar22 = vfmadd213ps_fma(auVar86,auVar184,auVar87);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar71 * 0x1d + 6);
  auVar87 = vpmovsxwd_avx(auVar25);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar71 + (ulong)(byte)PVar7 * 0x20 + 6);
  auVar86 = vpmovsxwd_avx(auVar88);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,auVar87);
  auVar23 = vfmadd213ps_fma(auVar86,auVar184,auVar87);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar7 * 0x20 - uVar71) + 6);
  auVar87 = vpmovsxwd_avx(auVar89);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar71 * 0x23 + 6);
  auVar86 = vpmovsxwd_avx(auVar29);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,auVar87);
  auVar86 = vfmadd213ps_fma(auVar86,auVar184,auVar87);
  auVar87 = vsubps_avx(auVar208,auVar31);
  auVar185._0_4_ = auVar90._0_4_ * auVar87._0_4_;
  auVar185._4_4_ = auVar90._4_4_ * auVar87._4_4_;
  auVar185._8_4_ = auVar90._8_4_ * auVar87._8_4_;
  auVar185._12_4_ = auVar90._12_4_ * auVar87._12_4_;
  auVar87 = vsubps_avx(auVar20,auVar31);
  auVar156._0_4_ = auVar90._0_4_ * auVar87._0_4_;
  auVar156._4_4_ = auVar90._4_4_ * auVar87._4_4_;
  auVar156._8_4_ = auVar90._8_4_ * auVar87._8_4_;
  auVar156._12_4_ = auVar90._12_4_ * auVar87._12_4_;
  auVar87 = vsubps_avx(auVar21,auVar139);
  auVar179._0_4_ = auVar30._0_4_ * auVar87._0_4_;
  auVar179._4_4_ = auVar30._4_4_ * auVar87._4_4_;
  auVar179._8_4_ = auVar30._8_4_ * auVar87._8_4_;
  auVar179._12_4_ = auVar30._12_4_ * auVar87._12_4_;
  auVar87 = vsubps_avx(auVar22,auVar139);
  auVar151._0_4_ = auVar30._0_4_ * auVar87._0_4_;
  auVar151._4_4_ = auVar30._4_4_ * auVar87._4_4_;
  auVar151._8_4_ = auVar30._8_4_ * auVar87._8_4_;
  auVar151._12_4_ = auVar30._12_4_ * auVar87._12_4_;
  auVar87 = vsubps_avx(auVar23,auVar140);
  auVar169._0_4_ = auVar28._0_4_ * auVar87._0_4_;
  auVar169._4_4_ = auVar28._4_4_ * auVar87._4_4_;
  auVar169._8_4_ = auVar28._8_4_ * auVar87._8_4_;
  auVar169._12_4_ = auVar28._12_4_ * auVar87._12_4_;
  auVar87 = vsubps_avx(auVar86,auVar140);
  auVar141._0_4_ = auVar28._0_4_ * auVar87._0_4_;
  auVar141._4_4_ = auVar28._4_4_ * auVar87._4_4_;
  auVar141._8_4_ = auVar28._8_4_ * auVar87._8_4_;
  auVar141._12_4_ = auVar28._12_4_ * auVar87._12_4_;
  auVar87 = vpminsd_avx(auVar185,auVar156);
  auVar86 = vpminsd_avx(auVar179,auVar151);
  auVar87 = vmaxps_avx(auVar87,auVar86);
  auVar86 = vpminsd_avx(auVar169,auVar141);
  uVar137 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar90._4_4_ = uVar137;
  auVar90._0_4_ = uVar137;
  auVar90._8_4_ = uVar137;
  auVar90._12_4_ = uVar137;
  auVar86 = vmaxps_avx512vl(auVar86,auVar90);
  auVar87 = vmaxps_avx(auVar87,auVar86);
  auVar30._8_4_ = 0x3f7ffffa;
  auVar30._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar30._12_4_ = 0x3f7ffffa;
  local_510 = vmulps_avx512vl(auVar87,auVar30);
  auVar87 = vpmaxsd_avx(auVar185,auVar156);
  auVar86 = vpmaxsd_avx(auVar179,auVar151);
  auVar87 = vminps_avx(auVar87,auVar86);
  auVar86 = vpmaxsd_avx(auVar169,auVar141);
  uVar137 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar28._4_4_ = uVar137;
  auVar28._0_4_ = uVar137;
  auVar28._8_4_ = uVar137;
  auVar28._12_4_ = uVar137;
  auVar86 = vminps_avx512vl(auVar86,auVar28);
  auVar87 = vminps_avx(auVar87,auVar86);
  auVar31._8_4_ = 0x3f800003;
  auVar31._0_8_ = 0x3f8000033f800003;
  auVar31._12_4_ = 0x3f800003;
  auVar87 = vmulps_avx512vl(auVar87,auVar31);
  auVar86 = vpbroadcastd_avx512vl();
  uVar138 = vcmpps_avx512vl(local_510,auVar87,2);
  uVar80 = vpcmpgtd_avx512vl(auVar86,_DAT_01ff0cf0);
  uVar80 = ((byte)uVar138 & 0xf) & uVar80;
  local_9e1 = (char)uVar80 != '\0';
  if (local_9e1) {
    local_8c8 = pre->ray_space + k;
    auVar149 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
    local_300 = vmovdqa64_avx512f(auVar149);
    do {
      lVar27 = 0;
      for (uVar71 = uVar80; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar78 = *(uint *)(prim + 2);
      pGVar9 = (context->scene->geometries).items[uVar78].ptr;
      local_440._0_8_ = CONCAT44(0,*(uint *)(prim + lVar27 * 4 + 6));
      uVar71 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                               CONCAT44(0,*(uint *)(prim + lVar27 * 4 + 6)) *
                               pGVar9[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar167 = (pGVar9->time_range).lower;
      fVar167 = pGVar9->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0x1c0) - fVar167) /
                ((pGVar9->time_range).upper - fVar167));
      auVar87 = vroundss_avx(ZEXT416((uint)fVar167),ZEXT416((uint)fVar167),9);
      auVar87 = vminss_avx(auVar87,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
      auVar87 = vmaxss_avx(ZEXT816(0) << 0x20,auVar87);
      fVar167 = fVar167 - auVar87._0_4_;
      fVar174 = 1.0 - fVar167;
      _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar74 = (long)(int)auVar87._0_4_ * 0x38;
      lVar79 = *(long *)(_Var10 + 0x10 + lVar74);
      lVar11 = *(long *)(_Var10 + 0x38 + lVar74);
      lVar12 = *(long *)(_Var10 + 0x48 + lVar74);
      auVar142._4_4_ = fVar167;
      auVar142._0_4_ = fVar167;
      auVar142._8_4_ = fVar167;
      auVar142._12_4_ = fVar167;
      pfVar3 = (float *)(lVar11 + lVar12 * uVar71);
      auVar190._0_4_ = fVar167 * *pfVar3;
      auVar190._4_4_ = fVar167 * pfVar3[1];
      auVar190._8_4_ = fVar167 * pfVar3[2];
      auVar190._12_4_ = fVar167 * pfVar3[3];
      lVar27 = uVar71 + 1;
      auVar87 = vmulps_avx512vl(auVar142,*(undefined1 (*) [16])(lVar11 + lVar12 * lVar27));
      p_Var13 = pGVar9[4].occlusionFilterN;
      auVar152._4_4_ = fVar174;
      auVar152._0_4_ = fVar174;
      auVar152._8_4_ = fVar174;
      auVar152._12_4_ = fVar174;
      local_950 = vfmadd231ps_fma(auVar190,auVar152,
                                  *(undefined1 (*) [16])
                                   (*(long *)(_Var10 + lVar74) + lVar79 * uVar71));
      local_790 = vfmadd231ps_avx512vl
                            (auVar87,auVar152,
                             *(undefined1 (*) [16])(*(long *)(_Var10 + lVar74) + lVar79 * lVar27));
      pfVar3 = (float *)(*(long *)(p_Var13 + lVar74 + 0x38) +
                        uVar71 * *(long *)(p_Var13 + lVar74 + 0x48));
      auVar191._0_4_ = fVar167 * *pfVar3;
      auVar191._4_4_ = fVar167 * pfVar3[1];
      auVar191._8_4_ = fVar167 * pfVar3[2];
      auVar191._12_4_ = fVar167 * pfVar3[3];
      pfVar3 = (float *)(*(long *)(p_Var13 + lVar74 + 0x38) +
                        *(long *)(p_Var13 + lVar74 + 0x48) * lVar27);
      auVar194._0_4_ = fVar167 * *pfVar3;
      auVar194._4_4_ = fVar167 * pfVar3[1];
      auVar194._8_4_ = fVar167 * pfVar3[2];
      auVar194._12_4_ = fVar167 * pfVar3[3];
      auVar86 = vfmadd231ps_fma(auVar191,auVar152,
                                *(undefined1 (*) [16])
                                 (*(long *)(p_Var13 + lVar74) +
                                 *(long *)(p_Var13 + lVar74 + 0x10) * uVar71));
      auVar208 = vfmadd231ps_fma(auVar194,auVar152,
                                 *(undefined1 (*) [16])
                                  (*(long *)(p_Var13 + lVar74) +
                                  *(long *)(p_Var13 + lVar74 + 0x10) * lVar27));
      iVar8 = (int)pGVar9[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar87 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40))
                              ,0x1c);
      auVar87 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
      lVar27 = (long)iVar8 * 0x44;
      auVar153._8_4_ = 0xbeaaaaab;
      auVar153._0_8_ = 0xbeaaaaabbeaaaaab;
      auVar153._12_4_ = 0xbeaaaaab;
      local_7a0 = vfnmadd213ps_fma(auVar86,auVar153,local_950);
      local_7b0 = vfmadd213ps_avx512vl(auVar208,auVar153,local_790);
      auVar208 = vsubps_avx(local_950,auVar87);
      uVar137 = auVar208._0_4_;
      auVar157._4_4_ = uVar137;
      auVar157._0_4_ = uVar137;
      auVar157._8_4_ = uVar137;
      auVar157._12_4_ = uVar137;
      auVar86 = vshufps_avx(auVar208,auVar208,0x55);
      aVar5 = (local_8c8->vx).field_0;
      aVar6 = (local_8c8->vy).field_0;
      fVar167 = (local_8c8->vz).field_0.m128[0];
      fVar174 = *(float *)((long)&(local_8c8->vz).field_0 + 4);
      fVar175 = *(float *)((long)&(local_8c8->vz).field_0 + 8);
      fVar176 = *(float *)((long)&(local_8c8->vz).field_0 + 0xc);
      auVar208 = vshufps_avx(auVar208,auVar208,0xaa);
      auVar193._0_4_ = fVar167 * auVar208._0_4_;
      auVar193._4_4_ = fVar174 * auVar208._4_4_;
      auVar193._8_4_ = fVar175 * auVar208._8_4_;
      auVar193._12_4_ = fVar176 * auVar208._12_4_;
      auVar86 = vfmadd231ps_fma(auVar193,(undefined1  [16])aVar6,auVar86);
      auVar20 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar5,auVar157);
      auVar208 = vsubps_avx(local_7a0,auVar87);
      uVar137 = auVar208._0_4_;
      auVar158._4_4_ = uVar137;
      auVar158._0_4_ = uVar137;
      auVar158._8_4_ = uVar137;
      auVar158._12_4_ = uVar137;
      auVar86 = vshufps_avx(auVar208,auVar208,0x55);
      auVar208 = vshufps_avx(auVar208,auVar208,0xaa);
      auVar195._0_4_ = fVar167 * auVar208._0_4_;
      auVar195._4_4_ = fVar174 * auVar208._4_4_;
      auVar195._8_4_ = fVar175 * auVar208._8_4_;
      auVar195._12_4_ = fVar176 * auVar208._12_4_;
      auVar86 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar6,auVar86);
      auVar21 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar5,auVar158);
      auVar208 = vsubps_avx(local_7b0,auVar87);
      uVar137 = auVar208._0_4_;
      auVar159._4_4_ = uVar137;
      auVar159._0_4_ = uVar137;
      auVar159._8_4_ = uVar137;
      auVar159._12_4_ = uVar137;
      auVar86 = vshufps_avx(auVar208,auVar208,0x55);
      auVar208 = vshufps_avx(auVar208,auVar208,0xaa);
      auVar196._0_4_ = fVar167 * auVar208._0_4_;
      auVar196._4_4_ = fVar174 * auVar208._4_4_;
      auVar196._8_4_ = fVar175 * auVar208._8_4_;
      auVar196._12_4_ = fVar176 * auVar208._12_4_;
      auVar86 = vfmadd231ps_fma(auVar196,(undefined1  [16])aVar6,auVar86);
      auVar208 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar5,auVar159);
      auVar86 = vsubps_avx512vl(local_790,auVar87);
      uVar137 = auVar86._0_4_;
      auVar154._4_4_ = uVar137;
      auVar154._0_4_ = uVar137;
      auVar154._8_4_ = uVar137;
      auVar154._12_4_ = uVar137;
      auVar87 = vshufps_avx(auVar86,auVar86,0x55);
      auVar86 = vshufps_avx(auVar86,auVar86,0xaa);
      auVar201._0_4_ = fVar167 * auVar86._0_4_;
      auVar201._4_4_ = fVar174 * auVar86._4_4_;
      auVar201._8_4_ = fVar175 * auVar86._8_4_;
      auVar201._12_4_ = fVar176 * auVar86._12_4_;
      auVar87 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar6,auVar87);
      auVar22 = vfmadd231ps_fma(auVar87,(undefined1  [16])aVar5,auVar154);
      auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar27);
      uVar137 = auVar20._0_4_;
      local_7e0._4_4_ = uVar137;
      local_7e0._0_4_ = uVar137;
      local_7e0._8_4_ = uVar137;
      local_7e0._12_4_ = uVar137;
      local_7e0._16_4_ = uVar137;
      local_7e0._20_4_ = uVar137;
      local_7e0._24_4_ = uVar137;
      local_7e0._28_4_ = uVar137;
      auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x484);
      auVar91._8_4_ = 1;
      auVar91._0_8_ = 0x100000001;
      auVar91._12_4_ = 1;
      auVar91._16_4_ = 1;
      auVar91._20_4_ = 1;
      auVar91._24_4_ = 1;
      auVar91._28_4_ = 1;
      local_720 = vpermps_avx2(auVar91,ZEXT1632(auVar20));
      local_800 = vbroadcastss_avx512vl(auVar21);
      local_740 = vpermps_avx512vl(auVar91,ZEXT1632(auVar21));
      auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x908);
      local_820 = vbroadcastss_avx512vl(auVar208);
      local_840 = vpermps_avx512vl(auVar91,ZEXT1632(auVar208));
      auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0xd8c);
      uVar137 = auVar22._0_4_;
      local_760._4_4_ = uVar137;
      local_760._0_4_ = uVar137;
      local_760._8_4_ = uVar137;
      local_760._12_4_ = uVar137;
      local_760._16_4_ = uVar137;
      local_760._20_4_ = uVar137;
      local_760._24_4_ = uVar137;
      local_760._28_4_ = uVar137;
      local_780 = vpermps_avx2(auVar91,ZEXT1632(auVar22));
      auVar91 = vmulps_avx512vl(local_760,auVar103);
      auVar92 = vmulps_avx512vl(local_780,auVar103);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar104,local_820);
      auVar92 = vfmadd231ps_avx512vl(auVar92,auVar104,local_840);
      auVar91 = vfmadd231ps_avx512vl(auVar91,auVar108,local_800);
      auVar93 = vfmadd231ps_avx512vl(auVar92,auVar108,local_740);
      auVar94 = vfmadd231ps_avx512vl(auVar91,auVar106,local_7e0);
      auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar27);
      auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x484);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x908);
      auVar95 = vfmadd231ps_avx512vl(auVar93,auVar106,local_720);
      auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0xd8c);
      auVar149 = ZEXT3264(local_760);
      auVar96 = vmulps_avx512vl(local_760,auVar93);
      auVar212 = ZEXT3264(local_780);
      auVar97 = vmulps_avx512vl(local_780,auVar93);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,local_820);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,local_840);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,local_800);
      auVar213 = ZEXT3264(local_740);
      auVar97 = vfmadd231ps_avx512vl(auVar97,auVar92,local_740);
      auVar23 = vfmadd231ps_fma(auVar96,auVar91,local_7e0);
      auVar24 = vfmadd231ps_fma(auVar97,auVar91,local_720);
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar23),auVar94);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar24),auVar95);
      auVar96 = vmulps_avx512vl(auVar95,auVar97);
      auVar99 = vmulps_avx512vl(auVar94,auVar98);
      auVar96 = vsubps_avx512vl(auVar96,auVar99);
      auVar87 = vshufps_avx(local_950,local_950,0xff);
      uVar138 = auVar87._0_8_;
      local_320._8_8_ = uVar138;
      local_320._0_8_ = uVar138;
      local_320._16_8_ = uVar138;
      local_320._24_8_ = uVar138;
      auVar87 = vshufps_avx(local_7a0,local_7a0,0xff);
      local_340 = vbroadcastsd_avx512vl(auVar87);
      auVar87 = vshufps_avx(local_7b0,local_7b0,0xff);
      local_360 = vbroadcastsd_avx512vl(auVar87);
      auVar87 = vshufps_avx512vl(local_790,local_790,0xff);
      uVar138 = auVar87._0_8_;
      register0x00001248 = uVar138;
      local_380 = uVar138;
      register0x00001250 = uVar138;
      register0x00001258 = uVar138;
      auVar99 = vmulps_avx512vl(_local_380,auVar103);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar104,local_360);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar108,local_340);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar106,local_320);
      auVar100 = vmulps_avx512vl(_local_380,auVar93);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar102,local_360);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar92,local_340);
      auVar25 = vfmadd231ps_fma(auVar100,auVar91,local_320);
      auVar100 = vmulps_avx512vl(auVar98,auVar98);
      auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,auVar97);
      auVar101 = vmaxps_avx512vl(auVar99,ZEXT1632(auVar25));
      auVar101 = vmulps_avx512vl(auVar101,auVar101);
      auVar100 = vmulps_avx512vl(auVar101,auVar100);
      auVar96 = vmulps_avx512vl(auVar96,auVar96);
      uVar138 = vcmpps_avx512vl(auVar96,auVar100,2);
      auVar87 = vblendps_avx(auVar20,local_950,8);
      auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar86 = vandps_avx512vl(auVar87,auVar88);
      auVar87 = vblendps_avx(auVar21,local_7a0,8);
      auVar87 = vandps_avx512vl(auVar87,auVar88);
      auVar86 = vmaxps_avx(auVar86,auVar87);
      auVar87 = vblendps_avx(auVar208,local_7b0,8);
      auVar89 = vandps_avx512vl(auVar87,auVar88);
      auVar87 = vblendps_avx(auVar22,local_790,8);
      auVar87 = vandps_avx512vl(auVar87,auVar88);
      auVar87 = vmaxps_avx(auVar89,auVar87);
      auVar87 = vmaxps_avx(auVar86,auVar87);
      auVar86 = vmovshdup_avx(auVar87);
      auVar86 = vmaxss_avx(auVar86,auVar87);
      auVar87 = vshufpd_avx(auVar87,auVar87,1);
      auVar87 = vmaxss_avx(auVar87,auVar86);
      auVar86 = vcvtsi2ss_avx512f(local_790,iVar8);
      local_480._0_16_ = auVar86;
      auVar100._0_4_ = auVar86._0_4_;
      auVar100._4_4_ = auVar100._0_4_;
      auVar100._8_4_ = auVar100._0_4_;
      auVar100._12_4_ = auVar100._0_4_;
      auVar100._16_4_ = auVar100._0_4_;
      auVar100._20_4_ = auVar100._0_4_;
      auVar100._24_4_ = auVar100._0_4_;
      auVar100._28_4_ = auVar100._0_4_;
      uVar26 = vcmpps_avx512vl(auVar100,_DAT_02020f40,0xe);
      local_630 = (byte)uVar138 & (byte)uVar26;
      _local_970 = vmulss_avx512f(auVar87,ZEXT416(0x35000000));
      auVar96._8_4_ = 2;
      auVar96._0_8_ = 0x200000002;
      auVar96._12_4_ = 2;
      auVar96._16_4_ = 2;
      auVar96._20_4_ = 2;
      auVar96._24_4_ = 2;
      auVar96._28_4_ = 2;
      local_3a0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar20));
      local_3c0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar21));
      local_3e0 = vpermps_avx512vl(auVar96,ZEXT1632(auVar208));
      auVar96 = vpermps_avx2(auVar96,ZEXT1632(auVar22));
      uVar137 = *(undefined4 *)(ray + k * 4 + 0xc0);
      auVar87 = auVar98._0_16_;
      uVar198 = local_970._0_4_;
      if (local_630 == 0) {
        bVar77 = false;
        auVar87 = vxorps_avx512vl(auVar87,auVar87);
        auVar209 = ZEXT1664(auVar87);
        auVar205 = ZEXT3264(local_7e0);
        auVar206 = ZEXT3264(local_720);
        auVar207 = ZEXT3264(local_800);
        auVar210 = ZEXT3264(local_820);
        auVar211 = ZEXT3264(local_840);
      }
      else {
        uStack_87c = 0;
        uStack_878 = 0;
        uStack_874 = 0;
        auVar93 = vmulps_avx512vl(auVar96,auVar93);
        auVar102 = vfmadd213ps_avx512vl(auVar102,local_3e0,auVar93);
        auVar92 = vfmadd213ps_avx512vl(auVar92,local_3c0,auVar102);
        auVar101 = vfmadd213ps_avx512vl(auVar91,local_3a0,auVar92);
        auVar103 = vmulps_avx512vl(auVar96,auVar103);
        auVar104 = vfmadd213ps_avx512vl(auVar104,local_3e0,auVar103);
        auVar92 = vfmadd213ps_avx512vl(auVar108,local_3c0,auVar104);
        auVar108 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1210);
        auVar104 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1694);
        auVar103 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1b18);
        auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1f9c);
        auVar105 = vfmadd213ps_avx512vl(auVar106,local_3a0,auVar92);
        auVar106 = vmulps_avx512vl(local_760,auVar91);
        auVar92 = vmulps_avx512vl(local_780,auVar91);
        auVar197._0_4_ = auVar96._0_4_ * auVar91._0_4_;
        auVar197._4_4_ = auVar96._4_4_ * auVar91._4_4_;
        auVar197._8_4_ = auVar96._8_4_ * auVar91._8_4_;
        auVar197._12_4_ = auVar96._12_4_ * auVar91._12_4_;
        auVar197._16_4_ = auVar96._16_4_ * auVar91._16_4_;
        auVar197._20_4_ = auVar96._20_4_ * auVar91._20_4_;
        auVar197._24_4_ = auVar96._24_4_ * auVar91._24_4_;
        auVar197._28_4_ = 0;
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,local_820);
        auVar91 = vfmadd231ps_avx512vl(auVar92,auVar103,local_840);
        auVar103 = vfmadd231ps_avx512vl(auVar197,local_3e0,auVar103);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar104,local_800);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar104,local_740);
        auVar92 = vfmadd231ps_avx512vl(auVar103,local_3c0,auVar104);
        auVar102 = vfmadd231ps_avx512vl(auVar106,auVar108,local_7e0);
        auVar91 = vfmadd231ps_avx512vl(auVar91,auVar108,local_720);
        auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1210);
        auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1b18);
        auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1f9c);
        auVar92 = vfmadd231ps_avx512vl(auVar92,local_3a0,auVar108);
        auVar93 = vmulps_avx512vl(local_760,auVar103);
        auVar107 = vmulps_avx512vl(local_780,auVar103);
        auVar108._4_4_ = auVar96._4_4_ * auVar103._4_4_;
        auVar108._0_4_ = auVar96._0_4_ * auVar103._0_4_;
        auVar108._8_4_ = auVar96._8_4_ * auVar103._8_4_;
        auVar108._12_4_ = auVar96._12_4_ * auVar103._12_4_;
        auVar108._16_4_ = auVar96._16_4_ * auVar103._16_4_;
        auVar108._20_4_ = auVar96._20_4_ * auVar103._20_4_;
        auVar108._24_4_ = auVar96._24_4_ * auVar103._24_4_;
        auVar108._28_4_ = auVar103._28_4_;
        auVar103 = vfmadd231ps_avx512vl(auVar93,auVar104,local_820);
        auVar93 = vfmadd231ps_avx512vl(auVar107,auVar104,local_840);
        auVar104 = vfmadd231ps_avx512vl(auVar108,local_3e0,auVar104);
        auVar108 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1694);
        auVar103 = vfmadd231ps_avx512vl(auVar103,auVar108,local_800);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar108,local_740);
        auVar108 = vfmadd231ps_avx512vl(auVar104,local_3c0,auVar108);
        auVar104 = vfmadd231ps_avx512vl(auVar103,auVar106,local_7e0);
        auVar103 = vfmadd231ps_avx512vl(auVar93,auVar106,local_720);
        auVar93 = vfmadd231ps_avx512vl(auVar108,local_3a0,auVar106);
        auVar202._8_4_ = 0x7fffffff;
        auVar202._0_8_ = 0x7fffffff7fffffff;
        auVar202._12_4_ = 0x7fffffff;
        auVar202._16_4_ = 0x7fffffff;
        auVar202._20_4_ = 0x7fffffff;
        auVar202._24_4_ = 0x7fffffff;
        auVar202._28_4_ = 0x7fffffff;
        auVar106 = vandps_avx(auVar102,auVar202);
        auVar108 = vandps_avx(auVar91,auVar202);
        auVar108 = vmaxps_avx(auVar106,auVar108);
        auVar106 = vandps_avx(auVar92,auVar202);
        auVar106 = vmaxps_avx(auVar108,auVar106);
        auVar92 = vbroadcastss_avx512vl(_local_970);
        uVar71 = vcmpps_avx512vl(auVar106,auVar92,1);
        bVar77 = (bool)((byte)uVar71 & 1);
        auVar107._0_4_ = (float)((uint)bVar77 * auVar97._0_4_ | (uint)!bVar77 * auVar102._0_4_);
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar77 * auVar97._4_4_ | (uint)!bVar77 * auVar102._4_4_);
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar77 * auVar97._8_4_ | (uint)!bVar77 * auVar102._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar77 * auVar97._12_4_ | (uint)!bVar77 * auVar102._12_4_);
        bVar77 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar107._16_4_ = (float)((uint)bVar77 * auVar97._16_4_ | (uint)!bVar77 * auVar102._16_4_);
        bVar77 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar107._20_4_ = (float)((uint)bVar77 * auVar97._20_4_ | (uint)!bVar77 * auVar102._20_4_);
        bVar77 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar107._24_4_ = (float)((uint)bVar77 * auVar97._24_4_ | (uint)!bVar77 * auVar102._24_4_);
        bVar77 = SUB81(uVar71 >> 7,0);
        auVar107._28_4_ = (uint)bVar77 * auVar97._28_4_ | (uint)!bVar77 * auVar102._28_4_;
        bVar77 = (bool)((byte)uVar71 & 1);
        auVar109._0_4_ = (float)((uint)bVar77 * auVar98._0_4_ | (uint)!bVar77 * auVar91._0_4_);
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar77 * auVar98._4_4_ | (uint)!bVar77 * auVar91._4_4_);
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar77 * auVar98._8_4_ | (uint)!bVar77 * auVar91._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar77 * auVar98._12_4_ | (uint)!bVar77 * auVar91._12_4_);
        bVar77 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar109._16_4_ = (float)((uint)bVar77 * auVar98._16_4_ | (uint)!bVar77 * auVar91._16_4_);
        bVar77 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar109._20_4_ = (float)((uint)bVar77 * auVar98._20_4_ | (uint)!bVar77 * auVar91._20_4_);
        bVar77 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar109._24_4_ = (float)((uint)bVar77 * auVar98._24_4_ | (uint)!bVar77 * auVar91._24_4_);
        bVar77 = SUB81(uVar71 >> 7,0);
        auVar109._28_4_ = (uint)bVar77 * auVar98._28_4_ | (uint)!bVar77 * auVar91._28_4_;
        auVar106 = vandps_avx(auVar202,auVar104);
        auVar108 = vandps_avx(auVar103,auVar202);
        auVar108 = vmaxps_avx(auVar106,auVar108);
        auVar106 = vandps_avx(auVar93,auVar202);
        auVar106 = vmaxps_avx(auVar108,auVar106);
        uVar71 = vcmpps_avx512vl(auVar106,auVar92,1);
        bVar77 = (bool)((byte)uVar71 & 1);
        auVar110._0_4_ = (float)((uint)bVar77 * auVar97._0_4_ | (uint)!bVar77 * auVar104._0_4_);
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar110._4_4_ = (float)((uint)bVar77 * auVar97._4_4_ | (uint)!bVar77 * auVar104._4_4_);
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar110._8_4_ = (float)((uint)bVar77 * auVar97._8_4_ | (uint)!bVar77 * auVar104._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar110._12_4_ = (float)((uint)bVar77 * auVar97._12_4_ | (uint)!bVar77 * auVar104._12_4_);
        bVar77 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar110._16_4_ = (float)((uint)bVar77 * auVar97._16_4_ | (uint)!bVar77 * auVar104._16_4_);
        bVar77 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar110._20_4_ = (float)((uint)bVar77 * auVar97._20_4_ | (uint)!bVar77 * auVar104._20_4_);
        bVar77 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar110._24_4_ = (float)((uint)bVar77 * auVar97._24_4_ | (uint)!bVar77 * auVar104._24_4_);
        bVar77 = SUB81(uVar71 >> 7,0);
        auVar110._28_4_ = (uint)bVar77 * auVar97._28_4_ | (uint)!bVar77 * auVar104._28_4_;
        bVar77 = (bool)((byte)uVar71 & 1);
        auVar111._0_4_ = (float)((uint)bVar77 * auVar98._0_4_ | (uint)!bVar77 * auVar103._0_4_);
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar77 * auVar98._4_4_ | (uint)!bVar77 * auVar103._4_4_);
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar77 * auVar98._8_4_ | (uint)!bVar77 * auVar103._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar77 * auVar98._12_4_ | (uint)!bVar77 * auVar103._12_4_);
        bVar77 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar77 * auVar98._16_4_ | (uint)!bVar77 * auVar103._16_4_);
        bVar77 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar77 * auVar98._20_4_ | (uint)!bVar77 * auVar103._20_4_);
        bVar77 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar77 * auVar98._24_4_ | (uint)!bVar77 * auVar103._24_4_);
        bVar77 = SUB81(uVar71 >> 7,0);
        auVar111._28_4_ = (uint)bVar77 * auVar98._28_4_ | (uint)!bVar77 * auVar103._28_4_;
        auVar90 = vxorps_avx512vl(auVar87,auVar87);
        auVar209 = ZEXT1664(auVar90);
        auVar106 = vfmadd213ps_avx512vl(auVar107,auVar107,ZEXT1632(auVar90));
        auVar87 = vfmadd231ps_fma(auVar106,auVar109,auVar109);
        auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar87));
        fVar167 = auVar108._0_4_;
        fVar174 = auVar108._4_4_;
        fVar175 = auVar108._8_4_;
        fVar176 = auVar108._12_4_;
        fVar160 = auVar108._16_4_;
        fVar166 = auVar108._20_4_;
        fVar81 = auVar108._24_4_;
        auVar106._4_4_ = fVar174 * fVar174 * fVar174 * auVar87._4_4_ * -0.5;
        auVar106._0_4_ = fVar167 * fVar167 * fVar167 * auVar87._0_4_ * -0.5;
        auVar106._8_4_ = fVar175 * fVar175 * fVar175 * auVar87._8_4_ * -0.5;
        auVar106._12_4_ = fVar176 * fVar176 * fVar176 * auVar87._12_4_ * -0.5;
        auVar106._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
        auVar106._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar106._24_4_ = fVar81 * fVar81 * fVar81 * -0.0;
        auVar106._28_4_ = auVar93._28_4_;
        auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar91,auVar108);
        auVar104._4_4_ = auVar109._4_4_ * auVar106._4_4_;
        auVar104._0_4_ = auVar109._0_4_ * auVar106._0_4_;
        auVar104._8_4_ = auVar109._8_4_ * auVar106._8_4_;
        auVar104._12_4_ = auVar109._12_4_ * auVar106._12_4_;
        auVar104._16_4_ = auVar109._16_4_ * auVar106._16_4_;
        auVar104._20_4_ = auVar109._20_4_ * auVar106._20_4_;
        auVar104._24_4_ = auVar109._24_4_ * auVar106._24_4_;
        auVar104._28_4_ = 0;
        auVar103._4_4_ = auVar106._4_4_ * -auVar107._4_4_;
        auVar103._0_4_ = auVar106._0_4_ * -auVar107._0_4_;
        auVar103._8_4_ = auVar106._8_4_ * -auVar107._8_4_;
        auVar103._12_4_ = auVar106._12_4_ * -auVar107._12_4_;
        auVar103._16_4_ = auVar106._16_4_ * -auVar107._16_4_;
        auVar103._20_4_ = auVar106._20_4_ * -auVar107._20_4_;
        auVar103._24_4_ = auVar106._24_4_ * -auVar107._24_4_;
        auVar103._28_4_ = auVar109._28_4_;
        auVar106 = vmulps_avx512vl(auVar106,ZEXT1632(auVar90));
        auVar97 = ZEXT1632(auVar90);
        auVar108 = vfmadd213ps_avx512vl(auVar110,auVar110,auVar97);
        auVar87 = vfmadd231ps_fma(auVar108,auVar111,auVar111);
        auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar87));
        fVar167 = auVar108._0_4_;
        fVar174 = auVar108._4_4_;
        fVar175 = auVar108._8_4_;
        fVar176 = auVar108._12_4_;
        fVar160 = auVar108._16_4_;
        fVar166 = auVar108._20_4_;
        fVar81 = auVar108._24_4_;
        auVar92._4_4_ = fVar174 * fVar174 * fVar174 * auVar87._4_4_ * -0.5;
        auVar92._0_4_ = fVar167 * fVar167 * fVar167 * auVar87._0_4_ * -0.5;
        auVar92._8_4_ = fVar175 * fVar175 * fVar175 * auVar87._8_4_ * -0.5;
        auVar92._12_4_ = fVar176 * fVar176 * fVar176 * auVar87._12_4_ * -0.5;
        auVar92._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
        auVar92._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar92._24_4_ = fVar81 * fVar81 * fVar81 * -0.0;
        auVar92._28_4_ = 0;
        auVar91 = vfmadd231ps_avx512vl(auVar92,auVar91,auVar108);
        auVar102._4_4_ = auVar111._4_4_ * auVar91._4_4_;
        auVar102._0_4_ = auVar111._0_4_ * auVar91._0_4_;
        auVar102._8_4_ = auVar111._8_4_ * auVar91._8_4_;
        auVar102._12_4_ = auVar111._12_4_ * auVar91._12_4_;
        auVar102._16_4_ = auVar111._16_4_ * auVar91._16_4_;
        auVar102._20_4_ = auVar111._20_4_ * auVar91._20_4_;
        auVar102._24_4_ = auVar111._24_4_ * auVar91._24_4_;
        auVar102._28_4_ = auVar108._28_4_;
        auVar93._4_4_ = -auVar110._4_4_ * auVar91._4_4_;
        auVar93._0_4_ = -auVar110._0_4_ * auVar91._0_4_;
        auVar93._8_4_ = -auVar110._8_4_ * auVar91._8_4_;
        auVar93._12_4_ = -auVar110._12_4_ * auVar91._12_4_;
        auVar93._16_4_ = -auVar110._16_4_ * auVar91._16_4_;
        auVar93._20_4_ = -auVar110._20_4_ * auVar91._20_4_;
        auVar93._24_4_ = -auVar110._24_4_ * auVar91._24_4_;
        auVar93._28_4_ = auVar110._28_4_ ^ 0x80000000;
        auVar108 = vmulps_avx512vl(auVar91,auVar97);
        auVar87 = vfmadd213ps_fma(auVar104,auVar99,auVar94);
        auVar86 = vfmadd213ps_fma(auVar103,auVar99,auVar95);
        auVar91 = vfmadd213ps_avx512vl(auVar106,auVar99,auVar105);
        auVar92 = vfmadd213ps_avx512vl(auVar102,ZEXT1632(auVar25),ZEXT1632(auVar23));
        auVar88 = vfnmadd213ps_fma(auVar104,auVar99,auVar94);
        auVar94 = ZEXT1632(auVar25);
        auVar208 = vfmadd213ps_fma(auVar93,auVar94,ZEXT1632(auVar24));
        auVar89 = vfnmadd213ps_fma(auVar103,auVar99,auVar95);
        auVar20 = vfmadd213ps_fma(auVar108,auVar94,auVar101);
        auVar104 = vfnmadd231ps_avx512vl(auVar105,auVar99,auVar106);
        auVar23 = vfnmadd213ps_fma(auVar102,auVar94,ZEXT1632(auVar23));
        auVar24 = vfnmadd213ps_fma(auVar93,auVar94,ZEXT1632(auVar24));
        auVar29 = vfnmadd231ps_fma(auVar101,ZEXT1632(auVar25),auVar108);
        auVar108 = vsubps_avx512vl(auVar92,ZEXT1632(auVar88));
        auVar106 = vsubps_avx(ZEXT1632(auVar208),ZEXT1632(auVar89));
        auVar103 = vsubps_avx512vl(ZEXT1632(auVar20),auVar104);
        auVar102 = vmulps_avx512vl(auVar106,auVar104);
        auVar21 = vfmsub231ps_fma(auVar102,ZEXT1632(auVar89),auVar103);
        auVar94._4_4_ = auVar88._4_4_ * auVar103._4_4_;
        auVar94._0_4_ = auVar88._0_4_ * auVar103._0_4_;
        auVar94._8_4_ = auVar88._8_4_ * auVar103._8_4_;
        auVar94._12_4_ = auVar88._12_4_ * auVar103._12_4_;
        auVar94._16_4_ = auVar103._16_4_ * 0.0;
        auVar94._20_4_ = auVar103._20_4_ * 0.0;
        auVar94._24_4_ = auVar103._24_4_ * 0.0;
        auVar94._28_4_ = auVar103._28_4_;
        auVar103 = vfmsub231ps_avx512vl(auVar94,auVar104,auVar108);
        auVar95._4_4_ = auVar89._4_4_ * auVar108._4_4_;
        auVar95._0_4_ = auVar89._0_4_ * auVar108._0_4_;
        auVar95._8_4_ = auVar89._8_4_ * auVar108._8_4_;
        auVar95._12_4_ = auVar89._12_4_ * auVar108._12_4_;
        auVar95._16_4_ = auVar108._16_4_ * 0.0;
        auVar95._20_4_ = auVar108._20_4_ * 0.0;
        auVar95._24_4_ = auVar108._24_4_ * 0.0;
        auVar95._28_4_ = auVar108._28_4_;
        auVar22 = vfmsub231ps_fma(auVar95,ZEXT1632(auVar88),auVar106);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar22),auVar97,auVar103);
        auVar106 = vfmadd231ps_avx512vl(auVar106,auVar97,ZEXT1632(auVar21));
        auVar107 = ZEXT1632(auVar90);
        uVar71 = vcmpps_avx512vl(auVar106,auVar107,2);
        bVar73 = (byte)uVar71;
        fVar81 = (float)((uint)(bVar73 & 1) * auVar87._0_4_ |
                        (uint)!(bool)(bVar73 & 1) * auVar23._0_4_);
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        fVar128 = (float)((uint)bVar77 * auVar87._4_4_ | (uint)!bVar77 * auVar23._4_4_);
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        fVar130 = (float)((uint)bVar77 * auVar87._8_4_ | (uint)!bVar77 * auVar23._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        fVar133 = (float)((uint)bVar77 * auVar87._12_4_ | (uint)!bVar77 * auVar23._12_4_);
        auVar102 = ZEXT1632(CONCAT412(fVar133,CONCAT48(fVar130,CONCAT44(fVar128,fVar81))));
        fVar82 = (float)((uint)(bVar73 & 1) * auVar86._0_4_ |
                        (uint)!(bool)(bVar73 & 1) * auVar24._0_4_);
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        fVar129 = (float)((uint)bVar77 * auVar86._4_4_ | (uint)!bVar77 * auVar24._4_4_);
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        fVar131 = (float)((uint)bVar77 * auVar86._8_4_ | (uint)!bVar77 * auVar24._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        fVar134 = (float)((uint)bVar77 * auVar86._12_4_ | (uint)!bVar77 * auVar24._12_4_);
        auVar93 = ZEXT1632(CONCAT412(fVar134,CONCAT48(fVar131,CONCAT44(fVar129,fVar82))));
        auVar105._0_4_ =
             (float)((uint)(bVar73 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar29._0_4_)
        ;
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar77 * auVar91._4_4_ | (uint)!bVar77 * auVar29._4_4_);
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar77 * auVar91._8_4_ | (uint)!bVar77 * auVar29._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar77 * auVar91._12_4_ | (uint)!bVar77 * auVar29._12_4_);
        fVar174 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar91._16_4_);
        auVar105._16_4_ = fVar174;
        fVar167 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar91._20_4_);
        auVar105._20_4_ = fVar167;
        fVar175 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar91._24_4_);
        auVar105._24_4_ = fVar175;
        iVar1 = (uint)(byte)(uVar71 >> 7) * auVar91._28_4_;
        auVar105._28_4_ = iVar1;
        auVar108 = vblendmps_avx512vl(ZEXT1632(auVar88),auVar92);
        auVar112._0_4_ =
             (uint)(bVar73 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar21._0_4_;
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar112._4_4_ = (uint)bVar77 * auVar108._4_4_ | (uint)!bVar77 * auVar21._4_4_;
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar112._8_4_ = (uint)bVar77 * auVar108._8_4_ | (uint)!bVar77 * auVar21._8_4_;
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar112._12_4_ = (uint)bVar77 * auVar108._12_4_ | (uint)!bVar77 * auVar21._12_4_;
        auVar112._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar108._16_4_;
        auVar112._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar108._20_4_;
        auVar112._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar108._24_4_;
        auVar112._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar108._28_4_;
        auVar108 = vblendmps_avx512vl(ZEXT1632(auVar89),ZEXT1632(auVar208));
        auVar113._0_4_ =
             (float)((uint)(bVar73 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar86._0_4_
                    );
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar77 * auVar108._4_4_ | (uint)!bVar77 * auVar86._4_4_);
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar77 * auVar108._8_4_ | (uint)!bVar77 * auVar86._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar77 * auVar108._12_4_ | (uint)!bVar77 * auVar86._12_4_);
        fVar176 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar108._16_4_);
        auVar113._16_4_ = fVar176;
        fVar160 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar108._20_4_);
        auVar113._20_4_ = fVar160;
        fVar166 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar108._24_4_);
        auVar113._24_4_ = fVar166;
        auVar113._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar108._28_4_;
        auVar108 = vblendmps_avx512vl(auVar104,ZEXT1632(auVar20));
        auVar114._0_4_ =
             (float)((uint)(bVar73 & 1) * auVar108._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar91._0_4_
                    );
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar114._4_4_ = (float)((uint)bVar77 * auVar108._4_4_ | (uint)!bVar77 * auVar91._4_4_);
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar114._8_4_ = (float)((uint)bVar77 * auVar108._8_4_ | (uint)!bVar77 * auVar91._8_4_);
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar114._12_4_ = (float)((uint)bVar77 * auVar108._12_4_ | (uint)!bVar77 * auVar91._12_4_);
        bVar77 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar114._16_4_ = (float)((uint)bVar77 * auVar108._16_4_ | (uint)!bVar77 * auVar91._16_4_);
        bVar77 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar114._20_4_ = (float)((uint)bVar77 * auVar108._20_4_ | (uint)!bVar77 * auVar91._20_4_);
        bVar77 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar114._24_4_ = (float)((uint)bVar77 * auVar108._24_4_ | (uint)!bVar77 * auVar91._24_4_);
        bVar77 = SUB81(uVar71 >> 7,0);
        auVar114._28_4_ = (uint)bVar77 * auVar108._28_4_ | (uint)!bVar77 * auVar91._28_4_;
        auVar115._0_4_ =
             (uint)(bVar73 & 1) * (int)auVar88._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar92._0_4_;
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar77 * (int)auVar88._4_4_ | (uint)!bVar77 * auVar92._4_4_;
        bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar77 * (int)auVar88._8_4_ | (uint)!bVar77 * auVar92._8_4_;
        bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar77 * (int)auVar88._12_4_ | (uint)!bVar77 * auVar92._12_4_;
        auVar115._16_4_ = (uint)!(bool)((byte)(uVar71 >> 4) & 1) * auVar92._16_4_;
        auVar115._20_4_ = (uint)!(bool)((byte)(uVar71 >> 5) & 1) * auVar92._20_4_;
        auVar115._24_4_ = (uint)!(bool)((byte)(uVar71 >> 6) & 1) * auVar92._24_4_;
        auVar115._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar92._28_4_;
        bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar71 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar116._0_4_ =
             (uint)(bVar73 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar20._0_4_;
        bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * auVar20._4_4_;
        bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * auVar20._8_4_;
        bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * auVar20._12_4_;
        auVar116._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar104._16_4_;
        auVar116._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar104._20_4_;
        auVar116._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar104._24_4_;
        iVar2 = (uint)(byte)(uVar71 >> 7) * auVar104._28_4_;
        auVar116._28_4_ = iVar2;
        auVar94 = vsubps_avx512vl(auVar115,auVar102);
        auVar108 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar89._12_4_ |
                                                 (uint)!bVar17 * auVar208._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar89._8_4_ |
                                                          (uint)!bVar15 * auVar208._8_4_,
                                                          CONCAT44((uint)bVar77 * (int)auVar89._4_4_
                                                                   | (uint)!bVar77 * auVar208._4_4_,
                                                                   (uint)(bVar73 & 1) *
                                                                   (int)auVar89._0_4_ |
                                                                   (uint)!(bool)(bVar73 & 1) *
                                                                   auVar208._0_4_)))),auVar93);
        auVar104 = vsubps_avx(auVar116,auVar105);
        auVar103 = vsubps_avx(auVar102,auVar112);
        auVar91 = vsubps_avx(auVar93,auVar113);
        auVar92 = vsubps_avx(auVar105,auVar114);
        auVar97._4_4_ = auVar104._4_4_ * fVar128;
        auVar97._0_4_ = auVar104._0_4_ * fVar81;
        auVar97._8_4_ = auVar104._8_4_ * fVar130;
        auVar97._12_4_ = auVar104._12_4_ * fVar133;
        auVar97._16_4_ = auVar104._16_4_ * 0.0;
        auVar97._20_4_ = auVar104._20_4_ * 0.0;
        auVar97._24_4_ = auVar104._24_4_ * 0.0;
        auVar97._28_4_ = iVar2;
        auVar87 = vfmsub231ps_fma(auVar97,auVar105,auVar94);
        auVar98._4_4_ = fVar129 * auVar94._4_4_;
        auVar98._0_4_ = fVar82 * auVar94._0_4_;
        auVar98._8_4_ = fVar131 * auVar94._8_4_;
        auVar98._12_4_ = fVar134 * auVar94._12_4_;
        auVar98._16_4_ = auVar94._16_4_ * 0.0;
        auVar98._20_4_ = auVar94._20_4_ * 0.0;
        auVar98._24_4_ = auVar94._24_4_ * 0.0;
        auVar98._28_4_ = auVar106._28_4_;
        auVar86 = vfmsub231ps_fma(auVar98,auVar102,auVar108);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar107,ZEXT1632(auVar87));
        auVar170._0_4_ = auVar108._0_4_ * auVar105._0_4_;
        auVar170._4_4_ = auVar108._4_4_ * auVar105._4_4_;
        auVar170._8_4_ = auVar108._8_4_ * auVar105._8_4_;
        auVar170._12_4_ = auVar108._12_4_ * auVar105._12_4_;
        auVar170._16_4_ = auVar108._16_4_ * fVar174;
        auVar170._20_4_ = auVar108._20_4_ * fVar167;
        auVar170._24_4_ = auVar108._24_4_ * fVar175;
        auVar170._28_4_ = 0;
        auVar87 = vfmsub231ps_fma(auVar170,auVar93,auVar104);
        auVar95 = vfmadd231ps_avx512vl(auVar106,auVar107,ZEXT1632(auVar87));
        auVar106 = vmulps_avx512vl(auVar92,auVar112);
        auVar106 = vfmsub231ps_avx512vl(auVar106,auVar103,auVar114);
        auVar101._4_4_ = auVar91._4_4_ * auVar114._4_4_;
        auVar101._0_4_ = auVar91._0_4_ * auVar114._0_4_;
        auVar101._8_4_ = auVar91._8_4_ * auVar114._8_4_;
        auVar101._12_4_ = auVar91._12_4_ * auVar114._12_4_;
        auVar101._16_4_ = auVar91._16_4_ * auVar114._16_4_;
        auVar101._20_4_ = auVar91._20_4_ * auVar114._20_4_;
        auVar101._24_4_ = auVar91._24_4_ * auVar114._24_4_;
        auVar101._28_4_ = auVar114._28_4_;
        auVar87 = vfmsub231ps_fma(auVar101,auVar113,auVar92);
        auVar171._0_4_ = auVar113._0_4_ * auVar103._0_4_;
        auVar171._4_4_ = auVar113._4_4_ * auVar103._4_4_;
        auVar171._8_4_ = auVar113._8_4_ * auVar103._8_4_;
        auVar171._12_4_ = auVar113._12_4_ * auVar103._12_4_;
        auVar171._16_4_ = fVar176 * auVar103._16_4_;
        auVar171._20_4_ = fVar160 * auVar103._20_4_;
        auVar171._24_4_ = fVar166 * auVar103._24_4_;
        auVar171._28_4_ = 0;
        auVar86 = vfmsub231ps_fma(auVar171,auVar91,auVar112);
        auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar107,auVar106);
        auVar97 = vfmadd231ps_avx512vl(auVar106,auVar107,ZEXT1632(auVar87));
        auVar106 = vmaxps_avx(auVar95,auVar97);
        uVar138 = vcmpps_avx512vl(auVar106,auVar107,2);
        local_630 = local_630 & (byte)uVar138;
        auVar205 = ZEXT3264(local_7e0);
        auVar206 = ZEXT3264(local_720);
        auVar207 = ZEXT3264(local_800);
        auVar210 = ZEXT3264(local_820);
        auVar211 = ZEXT3264(local_840);
        auVar149 = ZEXT3264(local_760);
        auVar200 = ZEXT1664(_local_970);
        if (local_630 == 0) {
          local_630 = 0;
        }
        else {
          auVar40._4_4_ = auVar92._4_4_ * auVar108._4_4_;
          auVar40._0_4_ = auVar92._0_4_ * auVar108._0_4_;
          auVar40._8_4_ = auVar92._8_4_ * auVar108._8_4_;
          auVar40._12_4_ = auVar92._12_4_ * auVar108._12_4_;
          auVar40._16_4_ = auVar92._16_4_ * auVar108._16_4_;
          auVar40._20_4_ = auVar92._20_4_ * auVar108._20_4_;
          auVar40._24_4_ = auVar92._24_4_ * auVar108._24_4_;
          auVar40._28_4_ = auVar106._28_4_;
          auVar208 = vfmsub231ps_fma(auVar40,auVar91,auVar104);
          auVar41._4_4_ = auVar104._4_4_ * auVar103._4_4_;
          auVar41._0_4_ = auVar104._0_4_ * auVar103._0_4_;
          auVar41._8_4_ = auVar104._8_4_ * auVar103._8_4_;
          auVar41._12_4_ = auVar104._12_4_ * auVar103._12_4_;
          auVar41._16_4_ = auVar104._16_4_ * auVar103._16_4_;
          auVar41._20_4_ = auVar104._20_4_ * auVar103._20_4_;
          auVar41._24_4_ = auVar104._24_4_ * auVar103._24_4_;
          auVar41._28_4_ = auVar104._28_4_;
          auVar86 = vfmsub231ps_fma(auVar41,auVar94,auVar92);
          auVar42._4_4_ = auVar91._4_4_ * auVar94._4_4_;
          auVar42._0_4_ = auVar91._0_4_ * auVar94._0_4_;
          auVar42._8_4_ = auVar91._8_4_ * auVar94._8_4_;
          auVar42._12_4_ = auVar91._12_4_ * auVar94._12_4_;
          auVar42._16_4_ = auVar91._16_4_ * auVar94._16_4_;
          auVar42._20_4_ = auVar91._20_4_ * auVar94._20_4_;
          auVar42._24_4_ = auVar91._24_4_ * auVar94._24_4_;
          auVar42._28_4_ = auVar91._28_4_;
          auVar20 = vfmsub231ps_fma(auVar42,auVar103,auVar108);
          auVar87 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar86),ZEXT1632(auVar20));
          auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar208),auVar107);
          auVar108 = vrcp14ps_avx512vl(auVar106);
          auVar33._8_4_ = 0x3f800000;
          auVar33._0_8_ = &DAT_3f8000003f800000;
          auVar33._12_4_ = 0x3f800000;
          auVar33._16_4_ = 0x3f800000;
          auVar33._20_4_ = 0x3f800000;
          auVar33._24_4_ = 0x3f800000;
          auVar33._28_4_ = 0x3f800000;
          auVar104 = vfnmadd213ps_avx512vl(auVar108,auVar106,auVar33);
          auVar87 = vfmadd132ps_fma(auVar104,auVar108,auVar108);
          auVar43._4_4_ = auVar20._4_4_ * auVar105._4_4_;
          auVar43._0_4_ = auVar20._0_4_ * auVar105._0_4_;
          auVar43._8_4_ = auVar20._8_4_ * auVar105._8_4_;
          auVar43._12_4_ = auVar20._12_4_ * auVar105._12_4_;
          auVar43._16_4_ = fVar174 * 0.0;
          auVar43._20_4_ = fVar167 * 0.0;
          auVar43._24_4_ = fVar175 * 0.0;
          auVar43._28_4_ = iVar1;
          auVar86 = vfmadd231ps_fma(auVar43,auVar93,ZEXT1632(auVar86));
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar102,ZEXT1632(auVar208));
          fVar167 = auVar87._0_4_;
          fVar174 = auVar87._4_4_;
          fVar175 = auVar87._8_4_;
          fVar176 = auVar87._12_4_;
          auVar108 = ZEXT1632(CONCAT412(auVar86._12_4_ * fVar176,
                                        CONCAT48(auVar86._8_4_ * fVar175,
                                                 CONCAT44(auVar86._4_4_ * fVar174,
                                                          auVar86._0_4_ * fVar167))));
          auVar188._4_4_ = uVar137;
          auVar188._0_4_ = uVar137;
          auVar188._8_4_ = uVar137;
          auVar188._12_4_ = uVar137;
          auVar188._16_4_ = uVar137;
          auVar188._20_4_ = uVar137;
          auVar188._24_4_ = uVar137;
          auVar188._28_4_ = uVar137;
          uVar138 = vcmpps_avx512vl(auVar188,auVar108,2);
          uVar4 = *(undefined4 *)(ray + k * 4 + 0x200);
          auVar34._4_4_ = uVar4;
          auVar34._0_4_ = uVar4;
          auVar34._8_4_ = uVar4;
          auVar34._12_4_ = uVar4;
          auVar34._16_4_ = uVar4;
          auVar34._20_4_ = uVar4;
          auVar34._24_4_ = uVar4;
          auVar34._28_4_ = uVar4;
          uVar26 = vcmpps_avx512vl(auVar108,auVar34,2);
          local_630 = (byte)uVar138 & (byte)uVar26 & local_630;
          if (local_630 != 0) {
            uVar138 = vcmpps_avx512vl(auVar106,auVar107,4);
            if ((local_630 & (byte)uVar138) != 0) {
              local_630 = local_630 & (byte)uVar138;
              fVar160 = auVar95._0_4_ * fVar167;
              fVar166 = auVar95._4_4_ * fVar174;
              auVar44._4_4_ = fVar166;
              auVar44._0_4_ = fVar160;
              fVar81 = auVar95._8_4_ * fVar175;
              auVar44._8_4_ = fVar81;
              fVar82 = auVar95._12_4_ * fVar176;
              auVar44._12_4_ = fVar82;
              fVar128 = auVar95._16_4_ * 0.0;
              auVar44._16_4_ = fVar128;
              fVar129 = auVar95._20_4_ * 0.0;
              auVar44._20_4_ = fVar129;
              fVar130 = auVar95._24_4_ * 0.0;
              auVar44._24_4_ = fVar130;
              auVar44._28_4_ = auVar95._28_4_;
              fVar167 = auVar97._0_4_ * fVar167;
              fVar174 = auVar97._4_4_ * fVar174;
              auVar45._4_4_ = fVar174;
              auVar45._0_4_ = fVar167;
              fVar175 = auVar97._8_4_ * fVar175;
              auVar45._8_4_ = fVar175;
              fVar176 = auVar97._12_4_ * fVar176;
              auVar45._12_4_ = fVar176;
              fVar131 = auVar97._16_4_ * 0.0;
              auVar45._16_4_ = fVar131;
              fVar133 = auVar97._20_4_ * 0.0;
              auVar45._20_4_ = fVar133;
              fVar134 = auVar97._24_4_ * 0.0;
              auVar45._24_4_ = fVar134;
              auVar45._28_4_ = auVar97._28_4_;
              auVar182._8_4_ = 0x3f800000;
              auVar182._0_8_ = &DAT_3f8000003f800000;
              auVar182._12_4_ = 0x3f800000;
              auVar182._16_4_ = 0x3f800000;
              auVar182._20_4_ = 0x3f800000;
              auVar182._24_4_ = 0x3f800000;
              auVar182._28_4_ = 0x3f800000;
              auVar106 = vsubps_avx(auVar182,auVar44);
              local_920._0_4_ =
                   (uint)(bVar73 & 1) * (int)fVar160 | (uint)!(bool)(bVar73 & 1) * auVar106._0_4_;
              bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
              local_920._4_4_ = (uint)bVar77 * (int)fVar166 | (uint)!bVar77 * auVar106._4_4_;
              bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
              local_920._8_4_ = (uint)bVar77 * (int)fVar81 | (uint)!bVar77 * auVar106._8_4_;
              bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
              local_920._12_4_ = (uint)bVar77 * (int)fVar82 | (uint)!bVar77 * auVar106._12_4_;
              bVar77 = (bool)((byte)(uVar71 >> 4) & 1);
              local_920._16_4_ = (uint)bVar77 * (int)fVar128 | (uint)!bVar77 * auVar106._16_4_;
              bVar77 = (bool)((byte)(uVar71 >> 5) & 1);
              local_920._20_4_ = (uint)bVar77 * (int)fVar129 | (uint)!bVar77 * auVar106._20_4_;
              bVar77 = (bool)((byte)(uVar71 >> 6) & 1);
              local_920._24_4_ = (uint)bVar77 * (int)fVar130 | (uint)!bVar77 * auVar106._24_4_;
              bVar77 = SUB81(uVar71 >> 7,0);
              local_920._28_4_ = (uint)bVar77 * auVar95._28_4_ | (uint)!bVar77 * auVar106._28_4_;
              auVar106 = vsubps_avx(auVar182,auVar45);
              local_540._0_4_ =
                   (uint)(bVar73 & 1) * (int)fVar167 | (uint)!(bool)(bVar73 & 1) * auVar106._0_4_;
              bVar77 = (bool)((byte)(uVar71 >> 1) & 1);
              local_540._4_4_ = (uint)bVar77 * (int)fVar174 | (uint)!bVar77 * auVar106._4_4_;
              bVar77 = (bool)((byte)(uVar71 >> 2) & 1);
              local_540._8_4_ = (uint)bVar77 * (int)fVar175 | (uint)!bVar77 * auVar106._8_4_;
              bVar77 = (bool)((byte)(uVar71 >> 3) & 1);
              local_540._12_4_ = (uint)bVar77 * (int)fVar176 | (uint)!bVar77 * auVar106._12_4_;
              bVar77 = (bool)((byte)(uVar71 >> 4) & 1);
              local_540._16_4_ = (uint)bVar77 * (int)fVar131 | (uint)!bVar77 * auVar106._16_4_;
              bVar77 = (bool)((byte)(uVar71 >> 5) & 1);
              local_540._20_4_ = (uint)bVar77 * (int)fVar133 | (uint)!bVar77 * auVar106._20_4_;
              bVar77 = (bool)((byte)(uVar71 >> 6) & 1);
              local_540._24_4_ = (uint)bVar77 * (int)fVar134 | (uint)!bVar77 * auVar106._24_4_;
              bVar77 = SUB81(uVar71 >> 7,0);
              local_540._28_4_ = (uint)bVar77 * auVar97._28_4_ | (uint)!bVar77 * auVar106._28_4_;
              local_940 = auVar108;
              goto LAB_01c8ca9f;
            }
          }
          local_630 = 0;
        }
LAB_01c8ca9f:
        auVar204 = ZEXT3264(auVar96);
        if (local_630 != 0) {
          auVar106 = vsubps_avx(ZEXT1632(auVar25),auVar99);
          auVar87 = vfmadd213ps_fma(auVar106,local_920,auVar99);
          uVar4 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
          auVar99._4_4_ = uVar4;
          auVar99._0_4_ = uVar4;
          auVar99._8_4_ = uVar4;
          auVar99._12_4_ = uVar4;
          auVar99._16_4_ = uVar4;
          auVar99._20_4_ = uVar4;
          auVar99._24_4_ = uVar4;
          auVar99._28_4_ = uVar4;
          auVar106 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar87._12_4_ + auVar87._12_4_,
                                                        CONCAT48(auVar87._8_4_ + auVar87._8_4_,
                                                                 CONCAT44(auVar87._4_4_ +
                                                                          auVar87._4_4_,
                                                                          auVar87._0_4_ +
                                                                          auVar87._0_4_)))),auVar99)
          ;
          uVar138 = vcmpps_avx512vl(local_940,auVar106,6);
          local_630 = local_630 & (byte)uVar138;
          if (local_630 != 0) {
            auVar147._8_4_ = 0xbf800000;
            auVar147._0_8_ = 0xbf800000bf800000;
            auVar147._12_4_ = 0xbf800000;
            auVar147._16_4_ = 0xbf800000;
            auVar147._20_4_ = 0xbf800000;
            auVar147._24_4_ = 0xbf800000;
            auVar147._28_4_ = 0xbf800000;
            auVar35._8_4_ = 0x40000000;
            auVar35._0_8_ = 0x4000000040000000;
            auVar35._12_4_ = 0x40000000;
            auVar35._16_4_ = 0x40000000;
            auVar35._20_4_ = 0x40000000;
            auVar35._24_4_ = 0x40000000;
            auVar35._28_4_ = 0x40000000;
            local_6c0 = vfmadd132ps_avx512vl(local_540,auVar147,auVar35);
            local_540 = local_6c0;
            auVar106 = local_540;
            local_680 = 0;
            local_670 = local_950._0_8_;
            uStack_668 = local_950._8_8_;
            local_660 = local_7a0._0_8_;
            uStack_658 = local_7a0._8_8_;
            local_650 = local_7b0._0_8_;
            uStack_648 = local_7b0._8_8_;
            local_640 = local_790._0_8_;
            uStack_638 = local_790._8_8_;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar77 = true, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar167 = 1.0 / auVar100._0_4_;
                local_620[0] = fVar167 * (local_920._0_4_ + 0.0);
                local_620[1] = fVar167 * (local_920._4_4_ + 1.0);
                local_620[2] = fVar167 * (local_920._8_4_ + 2.0);
                local_620[3] = fVar167 * (local_920._12_4_ + 3.0);
                fStack_610 = fVar167 * (local_920._16_4_ + 4.0);
                fStack_60c = fVar167 * (local_920._20_4_ + 5.0);
                fStack_608 = fVar167 * (local_920._24_4_ + 6.0);
                fStack_604 = local_920._28_4_ + 7.0;
                local_540._0_8_ = local_6c0._0_8_;
                local_540._8_8_ = local_6c0._8_8_;
                local_540._16_8_ = local_6c0._16_8_;
                local_540._24_8_ = local_6c0._24_8_;
                local_600 = local_540._0_8_;
                uStack_5f8 = local_540._8_8_;
                uStack_5f0 = local_540._16_8_;
                uStack_5e8 = local_540._24_8_;
                local_5e0 = local_940;
                lVar79 = 0;
                local_700 = (ulong)local_630;
                for (uVar71 = local_700; (uVar71 & 1) == 0;
                    uVar71 = uVar71 >> 1 | 0x8000000000000000) {
                  lVar79 = lVar79 + 1;
                }
                auVar126 = vpbroadcastd_avx512f();
                local_4c0 = vmovdqa64_avx512f(auVar126);
                local_960 = local_7a0._0_4_;
                uStack_95c = local_7a0._4_4_;
                uStack_958 = local_7a0._8_8_;
                auVar126 = vpbroadcastd_avx512f();
                local_500 = vmovdqa64_avx512f(auVar126);
                local_8e0 = local_7b0._0_8_;
                uStack_8d8 = local_7b0._8_8_;
                local_8f0 = local_790._0_4_;
                fStack_8ec = local_790._4_4_;
                fStack_8e8 = local_790._8_4_;
                fStack_8e4 = local_790._12_4_;
                bVar77 = true;
                local_880 = uVar137;
                local_860 = auVar96;
                local_6e0 = local_920;
                local_6a0 = local_940;
                local_67c = iVar8;
                local_540 = auVar106;
                do {
                  auVar208 = auVar209._0_16_;
                  uVar4 = *(undefined4 *)(ray + k * 4 + 0x200);
                  local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_620[lVar79]));
                  local_580 = (uint)lVar79;
                  uStack_57c = (undefined4)((ulong)lVar79 >> 0x20);
                  local_1c0 = vbroadcastss_avx512f
                                        (ZEXT416(*(uint *)((long)&local_600 + lVar79 * 4)));
                  *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5e0 + lVar79 * 4);
                  local_9a0.context = context->user;
                  fVar176 = local_200._0_4_;
                  fVar174 = 1.0 - fVar176;
                  fVar167 = fVar174 * fVar174 * -3.0;
                  auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar174 * fVar174)),
                                            ZEXT416((uint)(fVar176 * fVar174)),ZEXT416(0xc0000000));
                  auVar86 = vfmsub132ss_fma(ZEXT416((uint)(fVar176 * fVar174)),
                                            ZEXT416((uint)(fVar176 * fVar176)),ZEXT416(0x40000000));
                  fVar174 = auVar87._0_4_ * 3.0;
                  fVar175 = auVar86._0_4_ * 3.0;
                  fVar176 = fVar176 * fVar176 * 3.0;
                  auVar180._0_4_ = fVar176 * local_8f0;
                  auVar180._4_4_ = fVar176 * fStack_8ec;
                  auVar180._8_4_ = fVar176 * fStack_8e8;
                  auVar180._12_4_ = fVar176 * fStack_8e4;
                  auVar143._4_4_ = fVar175;
                  auVar143._0_4_ = fVar175;
                  auVar143._8_4_ = fVar175;
                  auVar143._12_4_ = fVar175;
                  auVar67._8_8_ = uStack_8d8;
                  auVar67._0_8_ = local_8e0;
                  auVar87 = vfmadd132ps_fma(auVar143,auVar180,auVar67);
                  auVar163._4_4_ = fVar174;
                  auVar163._0_4_ = fVar174;
                  auVar163._8_4_ = fVar174;
                  auVar163._12_4_ = fVar174;
                  auVar65._4_4_ = uStack_95c;
                  auVar65._0_4_ = local_960;
                  auVar65._8_8_ = uStack_958;
                  auVar87 = vfmadd132ps_fma(auVar163,auVar87,auVar65);
                  auVar144._4_4_ = fVar167;
                  auVar144._0_4_ = fVar167;
                  auVar144._8_4_ = fVar167;
                  auVar144._12_4_ = fVar167;
                  auVar87 = vfmadd132ps_fma(auVar144,auVar87,local_950);
                  auVar126 = vbroadcastss_avx512f(auVar87);
                  auVar127 = vbroadcastss_avx512f(ZEXT416(1));
                  local_280 = vpermps_avx512f(auVar127,ZEXT1664(auVar87));
                  auVar127 = vbroadcastss_avx512f(ZEXT416(2));
                  local_240 = vpermps_avx512f(auVar127,ZEXT1664(auVar87));
                  local_2c0[0] = (RTCHitN)auVar126[0];
                  local_2c0[1] = (RTCHitN)auVar126[1];
                  local_2c0[2] = (RTCHitN)auVar126[2];
                  local_2c0[3] = (RTCHitN)auVar126[3];
                  local_2c0[4] = (RTCHitN)auVar126[4];
                  local_2c0[5] = (RTCHitN)auVar126[5];
                  local_2c0[6] = (RTCHitN)auVar126[6];
                  local_2c0[7] = (RTCHitN)auVar126[7];
                  local_2c0[8] = (RTCHitN)auVar126[8];
                  local_2c0[9] = (RTCHitN)auVar126[9];
                  local_2c0[10] = (RTCHitN)auVar126[10];
                  local_2c0[0xb] = (RTCHitN)auVar126[0xb];
                  local_2c0[0xc] = (RTCHitN)auVar126[0xc];
                  local_2c0[0xd] = (RTCHitN)auVar126[0xd];
                  local_2c0[0xe] = (RTCHitN)auVar126[0xe];
                  local_2c0[0xf] = (RTCHitN)auVar126[0xf];
                  local_2c0[0x10] = (RTCHitN)auVar126[0x10];
                  local_2c0[0x11] = (RTCHitN)auVar126[0x11];
                  local_2c0[0x12] = (RTCHitN)auVar126[0x12];
                  local_2c0[0x13] = (RTCHitN)auVar126[0x13];
                  local_2c0[0x14] = (RTCHitN)auVar126[0x14];
                  local_2c0[0x15] = (RTCHitN)auVar126[0x15];
                  local_2c0[0x16] = (RTCHitN)auVar126[0x16];
                  local_2c0[0x17] = (RTCHitN)auVar126[0x17];
                  local_2c0[0x18] = (RTCHitN)auVar126[0x18];
                  local_2c0[0x19] = (RTCHitN)auVar126[0x19];
                  local_2c0[0x1a] = (RTCHitN)auVar126[0x1a];
                  local_2c0[0x1b] = (RTCHitN)auVar126[0x1b];
                  local_2c0[0x1c] = (RTCHitN)auVar126[0x1c];
                  local_2c0[0x1d] = (RTCHitN)auVar126[0x1d];
                  local_2c0[0x1e] = (RTCHitN)auVar126[0x1e];
                  local_2c0[0x1f] = (RTCHitN)auVar126[0x1f];
                  local_2c0[0x20] = (RTCHitN)auVar126[0x20];
                  local_2c0[0x21] = (RTCHitN)auVar126[0x21];
                  local_2c0[0x22] = (RTCHitN)auVar126[0x22];
                  local_2c0[0x23] = (RTCHitN)auVar126[0x23];
                  local_2c0[0x24] = (RTCHitN)auVar126[0x24];
                  local_2c0[0x25] = (RTCHitN)auVar126[0x25];
                  local_2c0[0x26] = (RTCHitN)auVar126[0x26];
                  local_2c0[0x27] = (RTCHitN)auVar126[0x27];
                  local_2c0[0x28] = (RTCHitN)auVar126[0x28];
                  local_2c0[0x29] = (RTCHitN)auVar126[0x29];
                  local_2c0[0x2a] = (RTCHitN)auVar126[0x2a];
                  local_2c0[0x2b] = (RTCHitN)auVar126[0x2b];
                  local_2c0[0x2c] = (RTCHitN)auVar126[0x2c];
                  local_2c0[0x2d] = (RTCHitN)auVar126[0x2d];
                  local_2c0[0x2e] = (RTCHitN)auVar126[0x2e];
                  local_2c0[0x2f] = (RTCHitN)auVar126[0x2f];
                  local_2c0[0x30] = (RTCHitN)auVar126[0x30];
                  local_2c0[0x31] = (RTCHitN)auVar126[0x31];
                  local_2c0[0x32] = (RTCHitN)auVar126[0x32];
                  local_2c0[0x33] = (RTCHitN)auVar126[0x33];
                  local_2c0[0x34] = (RTCHitN)auVar126[0x34];
                  local_2c0[0x35] = (RTCHitN)auVar126[0x35];
                  local_2c0[0x36] = (RTCHitN)auVar126[0x36];
                  local_2c0[0x37] = (RTCHitN)auVar126[0x37];
                  local_2c0[0x38] = (RTCHitN)auVar126[0x38];
                  local_2c0[0x39] = (RTCHitN)auVar126[0x39];
                  local_2c0[0x3a] = (RTCHitN)auVar126[0x3a];
                  local_2c0[0x3b] = (RTCHitN)auVar126[0x3b];
                  local_2c0[0x3c] = (RTCHitN)auVar126[0x3c];
                  local_2c0[0x3d] = (RTCHitN)auVar126[0x3d];
                  local_2c0[0x3e] = (RTCHitN)auVar126[0x3e];
                  local_2c0[0x3f] = (RTCHitN)auVar126[0x3f];
                  local_180 = local_500._0_8_;
                  uStack_178 = local_500._8_8_;
                  uStack_170 = local_500._16_8_;
                  uStack_168 = local_500._24_8_;
                  uStack_160 = local_500._32_8_;
                  uStack_158 = local_500._40_8_;
                  uStack_150 = local_500._48_8_;
                  uStack_148 = local_500._56_8_;
                  auVar126 = vmovdqa64_avx512f(local_4c0);
                  local_140 = vmovdqa64_avx512f(auVar126);
                  vpcmpeqd_avx2(auVar126._0_32_,auVar126._0_32_);
                  local_100 = vbroadcastss_avx512f(ZEXT416((local_9a0.context)->instID[0]));
                  local_c0 = vbroadcastss_avx512f(ZEXT416((local_9a0.context)->instPrimID[0]));
                  local_5c0 = local_300;
                  local_9a0.valid = (int *)local_5c0;
                  local_9a0.geometryUserPtr = pGVar9->userPtr;
                  local_9a0.hit = local_2c0;
                  local_9a0.N = 0x10;
                  local_9a0.ray = (RTCRayN *)ray;
                  if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->occlusionFilterN)(&local_9a0);
                    auVar200 = ZEXT1664(_local_970);
                    auVar204 = ZEXT3264(local_860);
                    auVar212 = ZEXT3264(local_780);
                    auVar149 = ZEXT3264(local_760);
                    auVar211 = ZEXT3264(local_840);
                    auVar210 = ZEXT3264(local_820);
                    auVar213 = ZEXT3264(local_740);
                    auVar207 = ZEXT3264(local_800);
                    auVar206 = ZEXT3264(local_720);
                    auVar205 = ZEXT3264(local_7e0);
                    auVar87 = vxorps_avx512vl(auVar208,auVar208);
                    auVar209 = ZEXT1664(auVar87);
                    uVar137 = local_880;
                  }
                  auVar87 = auVar209._0_16_;
                  auVar126 = vmovdqa64_avx512f(local_5c0);
                  uVar138 = vptestmd_avx512f(auVar126,auVar126);
                  if ((short)uVar138 != 0) {
                    p_Var13 = context->args->filter;
                    if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var13)(&local_9a0);
                      auVar200 = ZEXT1664(_local_970);
                      auVar204 = ZEXT3264(local_860);
                      auVar212 = ZEXT3264(local_780);
                      auVar149 = ZEXT3264(local_760);
                      auVar211 = ZEXT3264(local_840);
                      auVar210 = ZEXT3264(local_820);
                      auVar213 = ZEXT3264(local_740);
                      auVar207 = ZEXT3264(local_800);
                      auVar206 = ZEXT3264(local_720);
                      auVar205 = ZEXT3264(local_7e0);
                      auVar87 = vxorps_avx512vl(auVar87,auVar87);
                      auVar209 = ZEXT1664(auVar87);
                      uVar137 = local_880;
                    }
                    auVar96 = auVar204._0_32_;
                    auVar126 = vmovdqa64_avx512f(local_5c0);
                    uVar71 = vptestmd_avx512f(auVar126,auVar126);
                    auVar127 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                    bVar14 = (bool)((byte)uVar71 & 1);
                    auVar126._0_4_ =
                         (uint)bVar14 * auVar127._0_4_ |
                         (uint)!bVar14 * *(int *)(local_9a0.ray + 0x200);
                    bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
                    auVar126._4_4_ =
                         (uint)bVar14 * auVar127._4_4_ |
                         (uint)!bVar14 * *(int *)(local_9a0.ray + 0x204);
                    bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
                    auVar126._8_4_ =
                         (uint)bVar14 * auVar127._8_4_ |
                         (uint)!bVar14 * *(int *)(local_9a0.ray + 0x208);
                    bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
                    auVar126._12_4_ =
                         (uint)bVar14 * auVar127._12_4_ |
                         (uint)!bVar14 * *(int *)(local_9a0.ray + 0x20c);
                    bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
                    auVar126._16_4_ =
                         (uint)bVar14 * auVar127._16_4_ |
                         (uint)!bVar14 * *(int *)(local_9a0.ray + 0x210);
                    bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
                    auVar126._20_4_ =
                         (uint)bVar14 * auVar127._20_4_ |
                         (uint)!bVar14 * *(int *)(local_9a0.ray + 0x214);
                    bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
                    auVar126._24_4_ =
                         (uint)bVar14 * auVar127._24_4_ |
                         (uint)!bVar14 * *(int *)(local_9a0.ray + 0x218);
                    bVar14 = (bool)((byte)(uVar71 >> 7) & 1);
                    auVar126._28_4_ =
                         (uint)bVar14 * auVar127._28_4_ |
                         (uint)!bVar14 * *(int *)(local_9a0.ray + 0x21c);
                    bVar14 = (bool)((byte)(uVar71 >> 8) & 1);
                    auVar126._32_4_ =
                         (uint)bVar14 * auVar127._32_4_ |
                         (uint)!bVar14 * *(int *)(local_9a0.ray + 0x220);
                    bVar14 = (bool)((byte)(uVar71 >> 9) & 1);
                    auVar126._36_4_ =
                         (uint)bVar14 * auVar127._36_4_ |
                         (uint)!bVar14 * *(int *)(local_9a0.ray + 0x224);
                    bVar14 = (bool)((byte)(uVar71 >> 10) & 1);
                    auVar126._40_4_ =
                         (uint)bVar14 * auVar127._40_4_ |
                         (uint)!bVar14 * *(int *)(local_9a0.ray + 0x228);
                    bVar14 = (bool)((byte)(uVar71 >> 0xb) & 1);
                    auVar126._44_4_ =
                         (uint)bVar14 * auVar127._44_4_ |
                         (uint)!bVar14 * *(int *)(local_9a0.ray + 0x22c);
                    bVar14 = (bool)((byte)(uVar71 >> 0xc) & 1);
                    auVar126._48_4_ =
                         (uint)bVar14 * auVar127._48_4_ |
                         (uint)!bVar14 * *(int *)(local_9a0.ray + 0x230);
                    bVar14 = (bool)((byte)(uVar71 >> 0xd) & 1);
                    auVar126._52_4_ =
                         (uint)bVar14 * auVar127._52_4_ |
                         (uint)!bVar14 * *(int *)(local_9a0.ray + 0x234);
                    bVar14 = (bool)((byte)(uVar71 >> 0xe) & 1);
                    auVar126._56_4_ =
                         (uint)bVar14 * auVar127._56_4_ |
                         (uint)!bVar14 * *(int *)(local_9a0.ray + 0x238);
                    bVar14 = SUB81(uVar71 >> 0xf,0);
                    auVar126._60_4_ =
                         (uint)bVar14 * auVar127._60_4_ |
                         (uint)!bVar14 * *(int *)(local_9a0.ray + 0x23c);
                    *(undefined1 (*) [64])(local_9a0.ray + 0x200) = auVar126;
                    uVar198 = auVar200._0_4_;
                    if ((short)uVar71 != 0) break;
                  }
                  auVar96 = auVar204._0_32_;
                  *(undefined4 *)(ray + k * 4 + 0x200) = uVar4;
                  lVar79 = 0;
                  local_700 = local_700 ^ 1L << ((ulong)local_580 & 0x3f);
                  for (uVar71 = local_700; (uVar71 & 1) == 0;
                      uVar71 = uVar71 >> 1 | 0x8000000000000000) {
                    lVar79 = lVar79 + 1;
                  }
                  bVar77 = local_700 != 0;
                  uVar198 = auVar200._0_4_;
                } while (bVar77);
              }
              goto LAB_01c8d0bc;
            }
          }
        }
        bVar77 = false;
      }
LAB_01c8d0bc:
      local_880 = uVar198;
      if (8 < iVar8) {
        auVar106 = vpbroadcastd_avx512vl();
        auVar204 = ZEXT3264(auVar106);
        local_580 = uVar137;
        uStack_57c = uVar137;
        uStack_578 = uVar137;
        uStack_574 = uVar137;
        uStack_570 = uVar137;
        uStack_56c = uVar137;
        uStack_568 = uVar137;
        uStack_564 = uVar137;
        fStack_6f8 = 1.0 / (float)local_480._0_4_;
        auVar200 = vpbroadcastd_avx512f();
        local_480 = vmovdqa64_avx512f(auVar200);
        auVar200 = vpbroadcastd_avx512f();
        local_440 = vmovdqa64_avx512f(auVar200);
        lVar79 = 8;
        uStack_87c = local_880;
        uStack_878 = local_880;
        uStack_874 = local_880;
        uStack_870 = local_880;
        uStack_86c = local_880;
        uStack_868 = local_880;
        uStack_864 = local_880;
        local_860 = auVar96;
        fStack_6f4 = fStack_6f8;
        fStack_6f0 = fStack_6f8;
        fStack_6ec = fStack_6f8;
        fStack_6e8 = fStack_6f8;
        fStack_6e4 = fStack_6f8;
        local_700._0_4_ = fStack_6f8;
        local_700._4_4_ = fStack_6f8;
        do {
          auVar106 = vpbroadcastd_avx512vl();
          auVar91 = vpor_avx2(auVar106,_DAT_0205a920);
          uVar26 = vpcmpgtd_avx512vl(auVar204._0_32_,auVar91);
          auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar79 * 4 + lVar27);
          auVar108 = *(undefined1 (*) [32])(lVar27 + 0x2227768 + lVar79 * 4);
          auVar104 = *(undefined1 (*) [32])(lVar27 + 0x2227bec + lVar79 * 4);
          auVar103 = *(undefined1 (*) [32])(lVar27 + 0x2228070 + lVar79 * 4);
          local_760 = auVar149._0_32_;
          auVar92 = vmulps_avx512vl(local_760,auVar103);
          local_780 = auVar212._0_32_;
          auVar102 = vmulps_avx512vl(local_780,auVar103);
          auVar46._4_4_ = auVar103._4_4_ * (float)local_380._4_4_;
          auVar46._0_4_ = auVar103._0_4_ * (float)local_380._0_4_;
          auVar46._8_4_ = auVar103._8_4_ * fStack_378;
          auVar46._12_4_ = auVar103._12_4_ * fStack_374;
          auVar46._16_4_ = auVar103._16_4_ * fStack_370;
          auVar46._20_4_ = auVar103._20_4_ * fStack_36c;
          auVar46._24_4_ = auVar103._24_4_ * fStack_368;
          auVar46._28_4_ = auVar91._28_4_;
          auVar110 = auVar210._0_32_;
          auVar91 = vfmadd231ps_avx512vl(auVar92,auVar104,auVar110);
          auVar111 = auVar211._0_32_;
          auVar92 = vfmadd231ps_avx512vl(auVar102,auVar104,auVar111);
          auVar102 = vfmadd231ps_avx512vl(auVar46,auVar104,local_360);
          auVar109 = auVar207._0_32_;
          auVar91 = vfmadd231ps_avx512vl(auVar91,auVar108,auVar109);
          local_740 = auVar213._0_32_;
          auVar92 = vfmadd231ps_avx512vl(auVar92,auVar108,local_740);
          auVar87 = vfmadd231ps_fma(auVar102,auVar108,local_340);
          auVar107 = auVar205._0_32_;
          auVar95 = vfmadd231ps_avx512vl(auVar91,auVar106,auVar107);
          local_720 = auVar206._0_32_;
          auVar97 = vfmadd231ps_avx512vl(auVar92,auVar106,local_720);
          auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar79 * 4 + lVar27);
          auVar92 = *(undefined1 (*) [32])(lVar27 + 0x2229b88 + lVar79 * 4);
          auVar87 = vfmadd231ps_fma(ZEXT1632(auVar87),auVar106,local_320);
          auVar102 = *(undefined1 (*) [32])(lVar27 + 0x222a00c + lVar79 * 4);
          auVar93 = *(undefined1 (*) [32])(lVar27 + 0x222a490 + lVar79 * 4);
          auVar96 = vmulps_avx512vl(local_760,auVar93);
          auVar94 = vmulps_avx512vl(local_780,auVar93);
          auVar47._4_4_ = auVar93._4_4_ * (float)local_380._4_4_;
          auVar47._0_4_ = auVar93._0_4_ * (float)local_380._0_4_;
          auVar47._8_4_ = auVar93._8_4_ * fStack_378;
          auVar47._12_4_ = auVar93._12_4_ * fStack_374;
          auVar47._16_4_ = auVar93._16_4_ * fStack_370;
          auVar47._20_4_ = auVar93._20_4_ * fStack_36c;
          auVar47._24_4_ = auVar93._24_4_ * fStack_368;
          auVar47._28_4_ = uStack_364;
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,auVar110);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar102,auVar111);
          auVar98 = vfmadd231ps_avx512vl(auVar47,auVar102,local_360);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,auVar109);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar92,local_740);
          auVar86 = vfmadd231ps_fma(auVar98,auVar92,local_340);
          auVar98 = vfmadd231ps_avx512vl(auVar96,auVar91,auVar107);
          auVar99 = vfmadd231ps_avx512vl(auVar94,auVar91,local_720);
          auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar91,local_320);
          auVar100 = vmaxps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar86));
          auVar96 = vsubps_avx(auVar98,auVar95);
          auVar94 = vsubps_avx(auVar99,auVar97);
          auVar101 = vmulps_avx512vl(auVar97,auVar96);
          auVar105 = vmulps_avx512vl(auVar95,auVar94);
          auVar101 = vsubps_avx512vl(auVar101,auVar105);
          auVar105 = vmulps_avx512vl(auVar94,auVar94);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar96,auVar96);
          auVar100 = vmulps_avx512vl(auVar100,auVar100);
          auVar100 = vmulps_avx512vl(auVar100,auVar105);
          auVar101 = vmulps_avx512vl(auVar101,auVar101);
          uVar138 = vcmpps_avx512vl(auVar101,auVar100,2);
          local_630 = (byte)uVar26 & (byte)uVar138;
          if (local_630 != 0) {
            auVar93 = vmulps_avx512vl(local_860,auVar93);
            auVar102 = vfmadd213ps_avx512vl(auVar102,local_3e0,auVar93);
            auVar92 = vfmadd213ps_avx512vl(auVar92,local_3c0,auVar102);
            auVar91 = vfmadd213ps_avx512vl(auVar91,local_3a0,auVar92);
            auVar103 = vmulps_avx512vl(local_860,auVar103);
            auVar104 = vfmadd213ps_avx512vl(auVar104,local_3e0,auVar103);
            auVar108 = vfmadd213ps_avx512vl(auVar108,local_3c0,auVar104);
            auVar92 = vfmadd213ps_avx512vl(auVar106,local_3a0,auVar108);
            auVar106 = *(undefined1 (*) [32])(lVar27 + 0x22284f4 + lVar79 * 4);
            auVar108 = *(undefined1 (*) [32])(lVar27 + 0x2228978 + lVar79 * 4);
            auVar104 = *(undefined1 (*) [32])(lVar27 + 0x2228dfc + lVar79 * 4);
            auVar103 = *(undefined1 (*) [32])(lVar27 + 0x2229280 + lVar79 * 4);
            auVar102 = vmulps_avx512vl(local_760,auVar103);
            auVar93 = vmulps_avx512vl(local_780,auVar103);
            auVar103 = vmulps_avx512vl(local_860,auVar103);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar104,auVar110);
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar104,auVar111);
            auVar104 = vfmadd231ps_avx512vl(auVar103,local_3e0,auVar104);
            auVar103 = vfmadd231ps_avx512vl(auVar102,auVar108,auVar109);
            auVar102 = vfmadd231ps_avx512vl(auVar93,auVar108,local_740);
            auVar108 = vfmadd231ps_avx512vl(auVar104,local_3c0,auVar108);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar106,auVar107);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar106,local_720);
            auVar93 = vfmadd231ps_avx512vl(auVar108,local_3a0,auVar106);
            auVar106 = *(undefined1 (*) [32])(lVar27 + 0x222a914 + lVar79 * 4);
            auVar108 = *(undefined1 (*) [32])(lVar27 + 0x222b21c + lVar79 * 4);
            auVar104 = *(undefined1 (*) [32])(lVar27 + 0x222b6a0 + lVar79 * 4);
            auVar100 = vmulps_avx512vl(local_760,auVar104);
            auVar101 = vmulps_avx512vl(local_780,auVar104);
            auVar104 = vmulps_avx512vl(local_860,auVar104);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar108,auVar110);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,auVar111);
            auVar104 = vfmadd231ps_avx512vl(auVar104,local_3e0,auVar108);
            auVar108 = *(undefined1 (*) [32])(lVar27 + 0x222ad98 + lVar79 * 4);
            auVar100 = vfmadd231ps_avx512vl(auVar100,auVar108,auVar109);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar108,local_740);
            auVar108 = vfmadd231ps_avx512vl(auVar104,local_3c0,auVar108);
            auVar104 = vfmadd231ps_avx512vl(auVar100,auVar106,auVar107);
            auVar100 = vfmadd231ps_avx512vl(auVar101,auVar106,local_720);
            auVar108 = vfmadd231ps_avx512vl(auVar108,local_3a0,auVar106);
            auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar103,auVar101);
            vandps_avx512vl(auVar102,auVar101);
            auVar106 = vmaxps_avx(auVar101,auVar101);
            vandps_avx512vl(auVar93,auVar101);
            auVar106 = vmaxps_avx(auVar106,auVar101);
            auVar69._4_4_ = uStack_87c;
            auVar69._0_4_ = local_880;
            auVar69._8_4_ = uStack_878;
            auVar69._12_4_ = uStack_874;
            auVar69._16_4_ = uStack_870;
            auVar69._20_4_ = uStack_86c;
            auVar69._24_4_ = uStack_868;
            auVar69._28_4_ = uStack_864;
            uVar71 = vcmpps_avx512vl(auVar106,auVar69,1);
            bVar14 = (bool)((byte)uVar71 & 1);
            auVar117._0_4_ = (float)((uint)bVar14 * auVar96._0_4_ | (uint)!bVar14 * auVar103._0_4_);
            bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar103._4_4_);
            bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar103._8_4_);
            bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar103._12_4_);
            bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar117._16_4_ =
                 (float)((uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * auVar103._16_4_);
            bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar117._20_4_ =
                 (float)((uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * auVar103._20_4_);
            bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar117._24_4_ =
                 (float)((uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * auVar103._24_4_);
            bVar14 = SUB81(uVar71 >> 7,0);
            auVar117._28_4_ = (uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * auVar103._28_4_;
            bVar14 = (bool)((byte)uVar71 & 1);
            auVar118._0_4_ = (float)((uint)bVar14 * auVar94._0_4_ | (uint)!bVar14 * auVar102._0_4_);
            bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar118._4_4_ = (float)((uint)bVar14 * auVar94._4_4_ | (uint)!bVar14 * auVar102._4_4_);
            bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar118._8_4_ = (float)((uint)bVar14 * auVar94._8_4_ | (uint)!bVar14 * auVar102._8_4_);
            bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar118._12_4_ =
                 (float)((uint)bVar14 * auVar94._12_4_ | (uint)!bVar14 * auVar102._12_4_);
            bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar118._16_4_ =
                 (float)((uint)bVar14 * auVar94._16_4_ | (uint)!bVar14 * auVar102._16_4_);
            bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar118._20_4_ =
                 (float)((uint)bVar14 * auVar94._20_4_ | (uint)!bVar14 * auVar102._20_4_);
            bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar118._24_4_ =
                 (float)((uint)bVar14 * auVar94._24_4_ | (uint)!bVar14 * auVar102._24_4_);
            bVar14 = SUB81(uVar71 >> 7,0);
            auVar118._28_4_ = (uint)bVar14 * auVar94._28_4_ | (uint)!bVar14 * auVar102._28_4_;
            vandps_avx512vl(auVar104,auVar101);
            vandps_avx512vl(auVar100,auVar101);
            auVar106 = vmaxps_avx(auVar118,auVar118);
            vandps_avx512vl(auVar108,auVar101);
            auVar106 = vmaxps_avx(auVar106,auVar118);
            uVar71 = vcmpps_avx512vl(auVar106,auVar69,1);
            bVar14 = (bool)((byte)uVar71 & 1);
            auVar119._0_4_ = (uint)bVar14 * auVar96._0_4_ | (uint)!bVar14 * auVar104._0_4_;
            bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar119._4_4_ = (uint)bVar14 * auVar96._4_4_ | (uint)!bVar14 * auVar104._4_4_;
            bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar119._8_4_ = (uint)bVar14 * auVar96._8_4_ | (uint)!bVar14 * auVar104._8_4_;
            bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar119._12_4_ = (uint)bVar14 * auVar96._12_4_ | (uint)!bVar14 * auVar104._12_4_;
            bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar119._16_4_ = (uint)bVar14 * auVar96._16_4_ | (uint)!bVar14 * auVar104._16_4_;
            bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar119._20_4_ = (uint)bVar14 * auVar96._20_4_ | (uint)!bVar14 * auVar104._20_4_;
            bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar119._24_4_ = (uint)bVar14 * auVar96._24_4_ | (uint)!bVar14 * auVar104._24_4_;
            bVar14 = SUB81(uVar71 >> 7,0);
            auVar119._28_4_ = (uint)bVar14 * auVar96._28_4_ | (uint)!bVar14 * auVar104._28_4_;
            bVar14 = (bool)((byte)uVar71 & 1);
            auVar120._0_4_ = (float)((uint)bVar14 * auVar94._0_4_ | (uint)!bVar14 * auVar100._0_4_);
            bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar120._4_4_ = (float)((uint)bVar14 * auVar94._4_4_ | (uint)!bVar14 * auVar100._4_4_);
            bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar120._8_4_ = (float)((uint)bVar14 * auVar94._8_4_ | (uint)!bVar14 * auVar100._8_4_);
            bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar120._12_4_ =
                 (float)((uint)bVar14 * auVar94._12_4_ | (uint)!bVar14 * auVar100._12_4_);
            bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
            auVar120._16_4_ =
                 (float)((uint)bVar14 * auVar94._16_4_ | (uint)!bVar14 * auVar100._16_4_);
            bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
            auVar120._20_4_ =
                 (float)((uint)bVar14 * auVar94._20_4_ | (uint)!bVar14 * auVar100._20_4_);
            bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
            auVar120._24_4_ =
                 (float)((uint)bVar14 * auVar94._24_4_ | (uint)!bVar14 * auVar100._24_4_);
            bVar14 = SUB81(uVar71 >> 7,0);
            auVar120._28_4_ = (uint)bVar14 * auVar94._28_4_ | (uint)!bVar14 * auVar100._28_4_;
            auVar192._8_4_ = 0x80000000;
            auVar192._0_8_ = 0x8000000080000000;
            auVar192._12_4_ = 0x80000000;
            auVar192._16_4_ = 0x80000000;
            auVar192._20_4_ = 0x80000000;
            auVar192._24_4_ = 0x80000000;
            auVar192._28_4_ = 0x80000000;
            auVar106 = vxorps_avx512vl(auVar119,auVar192);
            auVar100 = auVar209._0_32_;
            auVar108 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar100);
            auVar208 = vfmadd231ps_fma(auVar108,auVar118,auVar118);
            auVar108 = vrsqrt14ps_avx512vl(ZEXT1632(auVar208));
            auVar203._8_4_ = 0xbf000000;
            auVar203._0_8_ = 0xbf000000bf000000;
            auVar203._12_4_ = 0xbf000000;
            auVar203._16_4_ = 0xbf000000;
            auVar203._20_4_ = 0xbf000000;
            auVar203._24_4_ = 0xbf000000;
            auVar203._28_4_ = 0xbf000000;
            fVar167 = auVar108._0_4_;
            fVar174 = auVar108._4_4_;
            fVar175 = auVar108._8_4_;
            fVar176 = auVar108._12_4_;
            fVar160 = auVar108._16_4_;
            fVar166 = auVar108._20_4_;
            fVar81 = auVar108._24_4_;
            auVar48._4_4_ = fVar174 * fVar174 * fVar174 * auVar208._4_4_ * -0.5;
            auVar48._0_4_ = fVar167 * fVar167 * fVar167 * auVar208._0_4_ * -0.5;
            auVar48._8_4_ = fVar175 * fVar175 * fVar175 * auVar208._8_4_ * -0.5;
            auVar48._12_4_ = fVar176 * fVar176 * fVar176 * auVar208._12_4_ * -0.5;
            auVar48._16_4_ = fVar160 * fVar160 * fVar160 * -0.0;
            auVar48._20_4_ = fVar166 * fVar166 * fVar166 * -0.0;
            auVar48._24_4_ = fVar81 * fVar81 * fVar81 * -0.0;
            auVar48._28_4_ = auVar118._28_4_;
            auVar104 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar108 = vfmadd231ps_avx512vl(auVar48,auVar104,auVar108);
            auVar49._4_4_ = auVar118._4_4_ * auVar108._4_4_;
            auVar49._0_4_ = auVar118._0_4_ * auVar108._0_4_;
            auVar49._8_4_ = auVar118._8_4_ * auVar108._8_4_;
            auVar49._12_4_ = auVar118._12_4_ * auVar108._12_4_;
            auVar49._16_4_ = auVar118._16_4_ * auVar108._16_4_;
            auVar49._20_4_ = auVar118._20_4_ * auVar108._20_4_;
            auVar49._24_4_ = auVar118._24_4_ * auVar108._24_4_;
            auVar49._28_4_ = 0;
            auVar50._4_4_ = auVar108._4_4_ * -auVar117._4_4_;
            auVar50._0_4_ = auVar108._0_4_ * -auVar117._0_4_;
            auVar50._8_4_ = auVar108._8_4_ * -auVar117._8_4_;
            auVar50._12_4_ = auVar108._12_4_ * -auVar117._12_4_;
            auVar50._16_4_ = auVar108._16_4_ * -auVar117._16_4_;
            auVar50._20_4_ = auVar108._20_4_ * -auVar117._20_4_;
            auVar50._24_4_ = auVar108._24_4_ * -auVar117._24_4_;
            auVar50._28_4_ = auVar118._28_4_;
            auVar103 = vmulps_avx512vl(auVar108,auVar100);
            auVar108 = vfmadd213ps_avx512vl(auVar119,auVar119,auVar100);
            auVar108 = vfmadd231ps_avx512vl(auVar108,auVar120,auVar120);
            auVar102 = vrsqrt14ps_avx512vl(auVar108);
            auVar108 = vmulps_avx512vl(auVar108,auVar203);
            fVar167 = auVar102._0_4_;
            fVar174 = auVar102._4_4_;
            fVar175 = auVar102._8_4_;
            fVar176 = auVar102._12_4_;
            fVar160 = auVar102._16_4_;
            fVar166 = auVar102._20_4_;
            fVar81 = auVar102._24_4_;
            auVar51._4_4_ = fVar174 * fVar174 * fVar174 * auVar108._4_4_;
            auVar51._0_4_ = fVar167 * fVar167 * fVar167 * auVar108._0_4_;
            auVar51._8_4_ = fVar175 * fVar175 * fVar175 * auVar108._8_4_;
            auVar51._12_4_ = fVar176 * fVar176 * fVar176 * auVar108._12_4_;
            auVar51._16_4_ = fVar160 * fVar160 * fVar160 * auVar108._16_4_;
            auVar51._20_4_ = fVar166 * fVar166 * fVar166 * auVar108._20_4_;
            auVar51._24_4_ = fVar81 * fVar81 * fVar81 * auVar108._24_4_;
            auVar51._28_4_ = auVar108._28_4_;
            auVar108 = vfmadd231ps_avx512vl(auVar51,auVar104,auVar102);
            auVar52._4_4_ = auVar120._4_4_ * auVar108._4_4_;
            auVar52._0_4_ = auVar120._0_4_ * auVar108._0_4_;
            auVar52._8_4_ = auVar120._8_4_ * auVar108._8_4_;
            auVar52._12_4_ = auVar120._12_4_ * auVar108._12_4_;
            auVar52._16_4_ = auVar120._16_4_ * auVar108._16_4_;
            auVar52._20_4_ = auVar120._20_4_ * auVar108._20_4_;
            auVar52._24_4_ = auVar120._24_4_ * auVar108._24_4_;
            auVar52._28_4_ = auVar102._28_4_;
            auVar53._4_4_ = auVar108._4_4_ * auVar106._4_4_;
            auVar53._0_4_ = auVar108._0_4_ * auVar106._0_4_;
            auVar53._8_4_ = auVar108._8_4_ * auVar106._8_4_;
            auVar53._12_4_ = auVar108._12_4_ * auVar106._12_4_;
            auVar53._16_4_ = auVar108._16_4_ * auVar106._16_4_;
            auVar53._20_4_ = auVar108._20_4_ * auVar106._20_4_;
            auVar53._24_4_ = auVar108._24_4_ * auVar106._24_4_;
            auVar53._28_4_ = auVar106._28_4_;
            auVar106 = vmulps_avx512vl(auVar108,auVar100);
            auVar208 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar87),auVar95);
            auVar108 = ZEXT1632(auVar87);
            auVar20 = vfmadd213ps_fma(auVar50,auVar108,auVar97);
            auVar104 = vfmadd213ps_avx512vl(auVar103,auVar108,auVar92);
            auVar102 = vfmadd213ps_avx512vl(auVar52,ZEXT1632(auVar86),auVar98);
            auVar25 = vfnmadd213ps_fma(auVar49,auVar108,auVar95);
            auVar93 = ZEXT1632(auVar86);
            auVar21 = vfmadd213ps_fma(auVar53,auVar93,auVar99);
            auVar88 = vfnmadd213ps_fma(auVar50,auVar108,auVar97);
            auVar22 = vfmadd213ps_fma(auVar106,auVar93,auVar91);
            auVar97 = ZEXT1632(auVar87);
            auVar90 = vfnmadd231ps_fma(auVar92,auVar97,auVar103);
            auVar89 = vfnmadd213ps_fma(auVar52,auVar93,auVar98);
            auVar29 = vfnmadd213ps_fma(auVar53,auVar93,auVar99);
            auVar30 = vfnmadd231ps_fma(auVar91,ZEXT1632(auVar86),auVar106);
            auVar91 = vsubps_avx512vl(auVar102,ZEXT1632(auVar25));
            auVar106 = vsubps_avx(ZEXT1632(auVar21),ZEXT1632(auVar88));
            auVar108 = vsubps_avx(ZEXT1632(auVar22),ZEXT1632(auVar90));
            auVar54._4_4_ = auVar106._4_4_ * auVar90._4_4_;
            auVar54._0_4_ = auVar106._0_4_ * auVar90._0_4_;
            auVar54._8_4_ = auVar106._8_4_ * auVar90._8_4_;
            auVar54._12_4_ = auVar106._12_4_ * auVar90._12_4_;
            auVar54._16_4_ = auVar106._16_4_ * 0.0;
            auVar54._20_4_ = auVar106._20_4_ * 0.0;
            auVar54._24_4_ = auVar106._24_4_ * 0.0;
            auVar54._28_4_ = auVar103._28_4_;
            auVar87 = vfmsub231ps_fma(auVar54,ZEXT1632(auVar88),auVar108);
            auVar55._4_4_ = auVar108._4_4_ * auVar25._4_4_;
            auVar55._0_4_ = auVar108._0_4_ * auVar25._0_4_;
            auVar55._8_4_ = auVar108._8_4_ * auVar25._8_4_;
            auVar55._12_4_ = auVar108._12_4_ * auVar25._12_4_;
            auVar55._16_4_ = auVar108._16_4_ * 0.0;
            auVar55._20_4_ = auVar108._20_4_ * 0.0;
            auVar55._24_4_ = auVar108._24_4_ * 0.0;
            auVar55._28_4_ = auVar108._28_4_;
            auVar23 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar90),auVar91);
            auVar56._4_4_ = auVar88._4_4_ * auVar91._4_4_;
            auVar56._0_4_ = auVar88._0_4_ * auVar91._0_4_;
            auVar56._8_4_ = auVar88._8_4_ * auVar91._8_4_;
            auVar56._12_4_ = auVar88._12_4_ * auVar91._12_4_;
            auVar56._16_4_ = auVar91._16_4_ * 0.0;
            auVar56._20_4_ = auVar91._20_4_ * 0.0;
            auVar56._24_4_ = auVar91._24_4_ * 0.0;
            auVar56._28_4_ = auVar91._28_4_;
            auVar24 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar25),auVar106);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar24),auVar100,ZEXT1632(auVar23));
            auVar106 = vfmadd231ps_avx512vl(auVar106,auVar100,ZEXT1632(auVar87));
            uVar71 = vcmpps_avx512vl(auVar106,auVar100,2);
            bVar73 = (byte)uVar71;
            fVar129 = (float)((uint)(bVar73 & 1) * auVar208._0_4_ |
                             (uint)!(bool)(bVar73 & 1) * auVar89._0_4_);
            bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
            fVar131 = (float)((uint)bVar14 * auVar208._4_4_ | (uint)!bVar14 * auVar89._4_4_);
            bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
            fVar134 = (float)((uint)bVar14 * auVar208._8_4_ | (uint)!bVar14 * auVar89._8_4_);
            bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
            fVar135 = (float)((uint)bVar14 * auVar208._12_4_ | (uint)!bVar14 * auVar89._12_4_);
            auVar93 = ZEXT1632(CONCAT412(fVar135,CONCAT48(fVar134,CONCAT44(fVar131,fVar129))));
            fVar130 = (float)((uint)(bVar73 & 1) * auVar20._0_4_ |
                             (uint)!(bool)(bVar73 & 1) * auVar29._0_4_);
            bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
            fVar133 = (float)((uint)bVar14 * auVar20._4_4_ | (uint)!bVar14 * auVar29._4_4_);
            bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
            fVar132 = (float)((uint)bVar14 * auVar20._8_4_ | (uint)!bVar14 * auVar29._8_4_);
            bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
            fVar136 = (float)((uint)bVar14 * auVar20._12_4_ | (uint)!bVar14 * auVar29._12_4_);
            auVar96 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar132,CONCAT44(fVar133,fVar130))));
            auVar121._0_4_ =
                 (float)((uint)(bVar73 & 1) * auVar104._0_4_ |
                        (uint)!(bool)(bVar73 & 1) * auVar30._0_4_);
            bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar121._4_4_ = (float)((uint)bVar14 * auVar104._4_4_ | (uint)!bVar14 * auVar30._4_4_);
            bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar121._8_4_ = (float)((uint)bVar14 * auVar104._8_4_ | (uint)!bVar14 * auVar30._8_4_);
            bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar121._12_4_ =
                 (float)((uint)bVar14 * auVar104._12_4_ | (uint)!bVar14 * auVar30._12_4_);
            fVar174 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar104._16_4_);
            auVar121._16_4_ = fVar174;
            fVar175 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar104._20_4_);
            auVar121._20_4_ = fVar175;
            fVar167 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar104._24_4_);
            auVar121._24_4_ = fVar167;
            iVar1 = (uint)(byte)(uVar71 >> 7) * auVar104._28_4_;
            auVar121._28_4_ = iVar1;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar25),auVar102);
            auVar122._0_4_ =
                 (uint)(bVar73 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar87._0_4_;
            bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar122._4_4_ = (uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * auVar87._4_4_;
            bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar122._8_4_ = (uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * auVar87._8_4_;
            bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar122._12_4_ = (uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * auVar87._12_4_;
            auVar122._16_4_ = (uint)((byte)(uVar71 >> 4) & 1) * auVar106._16_4_;
            auVar122._20_4_ = (uint)((byte)(uVar71 >> 5) & 1) * auVar106._20_4_;
            auVar122._24_4_ = (uint)((byte)(uVar71 >> 6) & 1) * auVar106._24_4_;
            auVar122._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar106._28_4_;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar88),ZEXT1632(auVar21));
            auVar123._0_4_ =
                 (float)((uint)(bVar73 & 1) * auVar106._0_4_ |
                        (uint)!(bool)(bVar73 & 1) * auVar208._0_4_);
            bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * auVar208._4_4_)
            ;
            bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * auVar208._8_4_)
            ;
            bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar123._12_4_ =
                 (float)((uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * auVar208._12_4_);
            fVar166 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar106._16_4_);
            auVar123._16_4_ = fVar166;
            fVar176 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar106._20_4_);
            auVar123._20_4_ = fVar176;
            fVar160 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar106._24_4_);
            auVar123._24_4_ = fVar160;
            auVar123._28_4_ = (uint)(byte)(uVar71 >> 7) * auVar106._28_4_;
            auVar106 = vblendmps_avx512vl(ZEXT1632(auVar90),ZEXT1632(auVar22));
            auVar124._0_4_ =
                 (float)((uint)(bVar73 & 1) * auVar106._0_4_ |
                        (uint)!(bool)(bVar73 & 1) * auVar20._0_4_);
            bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar14 * auVar106._4_4_ | (uint)!bVar14 * auVar20._4_4_);
            bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar14 * auVar106._8_4_ | (uint)!bVar14 * auVar20._8_4_);
            bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar14 * auVar106._12_4_ | (uint)!bVar14 * auVar20._12_4_);
            fVar128 = (float)((uint)((byte)(uVar71 >> 4) & 1) * auVar106._16_4_);
            auVar124._16_4_ = fVar128;
            fVar81 = (float)((uint)((byte)(uVar71 >> 5) & 1) * auVar106._20_4_);
            auVar124._20_4_ = fVar81;
            fVar82 = (float)((uint)((byte)(uVar71 >> 6) & 1) * auVar106._24_4_);
            auVar124._24_4_ = fVar82;
            iVar2 = (uint)(byte)(uVar71 >> 7) * auVar106._28_4_;
            auVar124._28_4_ = iVar2;
            auVar125._0_4_ =
                 (uint)(bVar73 & 1) * (int)auVar25._0_4_ |
                 (uint)!(bool)(bVar73 & 1) * auVar102._0_4_;
            bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
            auVar125._4_4_ = (uint)bVar14 * (int)auVar25._4_4_ | (uint)!bVar14 * auVar102._4_4_;
            bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
            auVar125._8_4_ = (uint)bVar14 * (int)auVar25._8_4_ | (uint)!bVar14 * auVar102._8_4_;
            bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar125._12_4_ = (uint)bVar14 * (int)auVar25._12_4_ | (uint)!bVar14 * auVar102._12_4_;
            auVar125._16_4_ = (uint)!(bool)((byte)(uVar71 >> 4) & 1) * auVar102._16_4_;
            auVar125._20_4_ = (uint)!(bool)((byte)(uVar71 >> 5) & 1) * auVar102._20_4_;
            auVar125._24_4_ = (uint)!(bool)((byte)(uVar71 >> 6) & 1) * auVar102._24_4_;
            auVar125._28_4_ = (uint)!SUB81(uVar71 >> 7,0) * auVar102._28_4_;
            bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar71 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar71 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar71 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar71 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar71 >> 3) & 1);
            auVar102 = vsubps_avx512vl(auVar125,auVar93);
            auVar108 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar88._12_4_ |
                                                     (uint)!bVar18 * auVar21._12_4_,
                                                     CONCAT48((uint)bVar17 * (int)auVar88._8_4_ |
                                                              (uint)!bVar17 * auVar21._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar88._4_4_ |
                                                                       (uint)!bVar14 * auVar21._4_4_
                                                                       ,(uint)(bVar73 & 1) *
                                                                        (int)auVar88._0_4_ |
                                                                        (uint)!(bool)(bVar73 & 1) *
                                                                        auVar21._0_4_)))),auVar96);
            auVar104 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar90._12_4_ |
                                                     (uint)!bVar19 * auVar22._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar90._8_4_ |
                                                              (uint)!bVar16 * auVar22._8_4_,
                                                              CONCAT44((uint)bVar15 *
                                                                       (int)auVar90._4_4_ |
                                                                       (uint)!bVar15 * auVar22._4_4_
                                                                       ,(uint)(bVar73 & 1) *
                                                                        (int)auVar90._0_4_ |
                                                                        (uint)!(bool)(bVar73 & 1) *
                                                                        auVar22._0_4_)))),auVar121);
            auVar103 = vsubps_avx(auVar93,auVar122);
            auVar91 = vsubps_avx(auVar96,auVar123);
            auVar92 = vsubps_avx(auVar121,auVar124);
            auVar57._4_4_ = auVar104._4_4_ * fVar131;
            auVar57._0_4_ = auVar104._0_4_ * fVar129;
            auVar57._8_4_ = auVar104._8_4_ * fVar134;
            auVar57._12_4_ = auVar104._12_4_ * fVar135;
            auVar57._16_4_ = auVar104._16_4_ * 0.0;
            auVar57._20_4_ = auVar104._20_4_ * 0.0;
            auVar57._24_4_ = auVar104._24_4_ * 0.0;
            auVar57._28_4_ = 0;
            auVar87 = vfmsub231ps_fma(auVar57,auVar121,auVar102);
            auVar165._0_4_ = fVar130 * auVar102._0_4_;
            auVar165._4_4_ = fVar133 * auVar102._4_4_;
            auVar165._8_4_ = fVar132 * auVar102._8_4_;
            auVar165._12_4_ = fVar136 * auVar102._12_4_;
            auVar165._16_4_ = auVar102._16_4_ * 0.0;
            auVar165._20_4_ = auVar102._20_4_ * 0.0;
            auVar165._24_4_ = auVar102._24_4_ * 0.0;
            auVar165._28_4_ = 0;
            auVar208 = vfmsub231ps_fma(auVar165,auVar93,auVar108);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar208),auVar100,ZEXT1632(auVar87));
            auVar172._0_4_ = auVar108._0_4_ * auVar121._0_4_;
            auVar172._4_4_ = auVar108._4_4_ * auVar121._4_4_;
            auVar172._8_4_ = auVar108._8_4_ * auVar121._8_4_;
            auVar172._12_4_ = auVar108._12_4_ * auVar121._12_4_;
            auVar172._16_4_ = auVar108._16_4_ * fVar174;
            auVar172._20_4_ = auVar108._20_4_ * fVar175;
            auVar172._24_4_ = auVar108._24_4_ * fVar167;
            auVar172._28_4_ = 0;
            auVar87 = vfmsub231ps_fma(auVar172,auVar96,auVar104);
            auVar94 = vfmadd231ps_avx512vl(auVar106,auVar100,ZEXT1632(auVar87));
            auVar106 = vmulps_avx512vl(auVar92,auVar122);
            auVar106 = vfmsub231ps_avx512vl(auVar106,auVar103,auVar124);
            auVar58._4_4_ = auVar91._4_4_ * auVar124._4_4_;
            auVar58._0_4_ = auVar91._0_4_ * auVar124._0_4_;
            auVar58._8_4_ = auVar91._8_4_ * auVar124._8_4_;
            auVar58._12_4_ = auVar91._12_4_ * auVar124._12_4_;
            auVar58._16_4_ = auVar91._16_4_ * fVar128;
            auVar58._20_4_ = auVar91._20_4_ * fVar81;
            auVar58._24_4_ = auVar91._24_4_ * fVar82;
            auVar58._28_4_ = iVar2;
            auVar87 = vfmsub231ps_fma(auVar58,auVar123,auVar92);
            auVar173._0_4_ = auVar123._0_4_ * auVar103._0_4_;
            auVar173._4_4_ = auVar123._4_4_ * auVar103._4_4_;
            auVar173._8_4_ = auVar123._8_4_ * auVar103._8_4_;
            auVar173._12_4_ = auVar123._12_4_ * auVar103._12_4_;
            auVar173._16_4_ = fVar166 * auVar103._16_4_;
            auVar173._20_4_ = fVar176 * auVar103._20_4_;
            auVar173._24_4_ = fVar160 * auVar103._24_4_;
            auVar173._28_4_ = 0;
            auVar208 = vfmsub231ps_fma(auVar173,auVar91,auVar122);
            auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar208),auVar100,auVar106);
            auVar95 = vfmadd231ps_avx512vl(auVar106,auVar100,ZEXT1632(auVar87));
            auVar106 = vmaxps_avx(auVar94,auVar95);
            uVar138 = vcmpps_avx512vl(auVar106,auVar100,2);
            local_630 = local_630 & (byte)uVar138;
            if (local_630 == 0) {
LAB_01c8dca7:
              local_630 = 0;
            }
            else {
              auVar59._4_4_ = auVar92._4_4_ * auVar108._4_4_;
              auVar59._0_4_ = auVar92._0_4_ * auVar108._0_4_;
              auVar59._8_4_ = auVar92._8_4_ * auVar108._8_4_;
              auVar59._12_4_ = auVar92._12_4_ * auVar108._12_4_;
              auVar59._16_4_ = auVar92._16_4_ * auVar108._16_4_;
              auVar59._20_4_ = auVar92._20_4_ * auVar108._20_4_;
              auVar59._24_4_ = auVar92._24_4_ * auVar108._24_4_;
              auVar59._28_4_ = auVar106._28_4_;
              auVar20 = vfmsub231ps_fma(auVar59,auVar91,auVar104);
              auVar60._4_4_ = auVar104._4_4_ * auVar103._4_4_;
              auVar60._0_4_ = auVar104._0_4_ * auVar103._0_4_;
              auVar60._8_4_ = auVar104._8_4_ * auVar103._8_4_;
              auVar60._12_4_ = auVar104._12_4_ * auVar103._12_4_;
              auVar60._16_4_ = auVar104._16_4_ * auVar103._16_4_;
              auVar60._20_4_ = auVar104._20_4_ * auVar103._20_4_;
              auVar60._24_4_ = auVar104._24_4_ * auVar103._24_4_;
              auVar60._28_4_ = auVar104._28_4_;
              auVar208 = vfmsub231ps_fma(auVar60,auVar102,auVar92);
              auVar61._4_4_ = auVar91._4_4_ * auVar102._4_4_;
              auVar61._0_4_ = auVar91._0_4_ * auVar102._0_4_;
              auVar61._8_4_ = auVar91._8_4_ * auVar102._8_4_;
              auVar61._12_4_ = auVar91._12_4_ * auVar102._12_4_;
              auVar61._16_4_ = auVar91._16_4_ * auVar102._16_4_;
              auVar61._20_4_ = auVar91._20_4_ * auVar102._20_4_;
              auVar61._24_4_ = auVar91._24_4_ * auVar102._24_4_;
              auVar61._28_4_ = auVar91._28_4_;
              auVar21 = vfmsub231ps_fma(auVar61,auVar103,auVar108);
              auVar87 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar208),ZEXT1632(auVar21));
              auVar106 = vfmadd231ps_avx512vl(ZEXT1632(auVar87),ZEXT1632(auVar20),auVar100);
              auVar108 = vrcp14ps_avx512vl(auVar106);
              auVar36._8_4_ = 0x3f800000;
              auVar36._0_8_ = &DAT_3f8000003f800000;
              auVar36._12_4_ = 0x3f800000;
              auVar36._16_4_ = 0x3f800000;
              auVar36._20_4_ = 0x3f800000;
              auVar36._24_4_ = 0x3f800000;
              auVar36._28_4_ = 0x3f800000;
              auVar104 = vfnmadd213ps_avx512vl(auVar108,auVar106,auVar36);
              auVar87 = vfmadd132ps_fma(auVar104,auVar108,auVar108);
              auVar62._4_4_ = auVar21._4_4_ * auVar121._4_4_;
              auVar62._0_4_ = auVar21._0_4_ * auVar121._0_4_;
              auVar62._8_4_ = auVar21._8_4_ * auVar121._8_4_;
              auVar62._12_4_ = auVar21._12_4_ * auVar121._12_4_;
              auVar62._16_4_ = fVar174 * 0.0;
              auVar62._20_4_ = fVar175 * 0.0;
              auVar62._24_4_ = fVar167 * 0.0;
              auVar62._28_4_ = iVar1;
              auVar208 = vfmadd231ps_fma(auVar62,auVar96,ZEXT1632(auVar208));
              auVar208 = vfmadd231ps_fma(ZEXT1632(auVar208),auVar93,ZEXT1632(auVar20));
              fVar167 = auVar87._0_4_;
              fVar174 = auVar87._4_4_;
              fVar175 = auVar87._8_4_;
              fVar176 = auVar87._12_4_;
              auVar108 = ZEXT1632(CONCAT412(auVar208._12_4_ * fVar176,
                                            CONCAT48(auVar208._8_4_ * fVar175,
                                                     CONCAT44(auVar208._4_4_ * fVar174,
                                                              auVar208._0_4_ * fVar167))));
              auVar70._4_4_ = uStack_57c;
              auVar70._0_4_ = local_580;
              auVar70._8_4_ = uStack_578;
              auVar70._12_4_ = uStack_574;
              auVar70._16_4_ = uStack_570;
              auVar70._20_4_ = uStack_56c;
              auVar70._24_4_ = uStack_568;
              auVar70._28_4_ = uStack_564;
              uVar138 = vcmpps_avx512vl(auVar108,auVar70,0xd);
              uVar137 = *(undefined4 *)(ray + k * 4 + 0x200);
              auVar37._4_4_ = uVar137;
              auVar37._0_4_ = uVar137;
              auVar37._8_4_ = uVar137;
              auVar37._12_4_ = uVar137;
              auVar37._16_4_ = uVar137;
              auVar37._20_4_ = uVar137;
              auVar37._24_4_ = uVar137;
              auVar37._28_4_ = uVar137;
              uVar26 = vcmpps_avx512vl(auVar108,auVar37,2);
              local_630 = (byte)uVar138 & (byte)uVar26 & local_630;
              if (local_630 == 0) goto LAB_01c8dca7;
              uVar138 = vcmpps_avx512vl(auVar106,auVar100,4);
              if ((local_630 & (byte)uVar138) == 0) goto LAB_01c8dca7;
              local_630 = local_630 & (byte)uVar138;
              fVar160 = auVar94._0_4_ * fVar167;
              fVar166 = auVar94._4_4_ * fVar174;
              auVar63._4_4_ = fVar166;
              auVar63._0_4_ = fVar160;
              fVar81 = auVar94._8_4_ * fVar175;
              auVar63._8_4_ = fVar81;
              fVar82 = auVar94._12_4_ * fVar176;
              auVar63._12_4_ = fVar82;
              fVar128 = auVar94._16_4_ * 0.0;
              auVar63._16_4_ = fVar128;
              fVar129 = auVar94._20_4_ * 0.0;
              auVar63._20_4_ = fVar129;
              fVar130 = auVar94._24_4_ * 0.0;
              auVar63._24_4_ = fVar130;
              auVar63._28_4_ = auVar94._28_4_;
              fVar167 = auVar95._0_4_ * fVar167;
              fVar174 = auVar95._4_4_ * fVar174;
              auVar64._4_4_ = fVar174;
              auVar64._0_4_ = fVar167;
              fVar175 = auVar95._8_4_ * fVar175;
              auVar64._8_4_ = fVar175;
              fVar176 = auVar95._12_4_ * fVar176;
              auVar64._12_4_ = fVar176;
              fVar131 = auVar95._16_4_ * 0.0;
              auVar64._16_4_ = fVar131;
              fVar133 = auVar95._20_4_ * 0.0;
              auVar64._20_4_ = fVar133;
              fVar134 = auVar95._24_4_ * 0.0;
              auVar64._24_4_ = fVar134;
              auVar64._28_4_ = auVar95._28_4_;
              auVar183._8_4_ = 0x3f800000;
              auVar183._0_8_ = &DAT_3f8000003f800000;
              auVar183._12_4_ = 0x3f800000;
              auVar183._16_4_ = 0x3f800000;
              auVar183._20_4_ = 0x3f800000;
              auVar183._24_4_ = 0x3f800000;
              auVar183._28_4_ = 0x3f800000;
              auVar106 = vsubps_avx(auVar183,auVar63);
              local_8a0._0_4_ =
                   (uint)(bVar73 & 1) * (int)fVar160 | (uint)!(bool)(bVar73 & 1) * auVar106._0_4_;
              bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
              local_8a0._4_4_ = (uint)bVar14 * (int)fVar166 | (uint)!bVar14 * auVar106._4_4_;
              bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
              local_8a0._8_4_ = (uint)bVar14 * (int)fVar81 | (uint)!bVar14 * auVar106._8_4_;
              bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
              local_8a0._12_4_ = (uint)bVar14 * (int)fVar82 | (uint)!bVar14 * auVar106._12_4_;
              bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
              local_8a0._16_4_ = (uint)bVar14 * (int)fVar128 | (uint)!bVar14 * auVar106._16_4_;
              bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
              local_8a0._20_4_ = (uint)bVar14 * (int)fVar129 | (uint)!bVar14 * auVar106._20_4_;
              bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
              local_8a0._24_4_ = (uint)bVar14 * (int)fVar130 | (uint)!bVar14 * auVar106._24_4_;
              bVar14 = SUB81(uVar71 >> 7,0);
              local_8a0._28_4_ = (uint)bVar14 * auVar94._28_4_ | (uint)!bVar14 * auVar106._28_4_;
              auVar106 = vsubps_avx(auVar183,auVar64);
              local_560._0_4_ =
                   (uint)(bVar73 & 1) * (int)fVar167 | (uint)!(bool)(bVar73 & 1) * auVar106._0_4_;
              bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
              local_560._4_4_ = (uint)bVar14 * (int)fVar174 | (uint)!bVar14 * auVar106._4_4_;
              bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
              local_560._8_4_ = (uint)bVar14 * (int)fVar175 | (uint)!bVar14 * auVar106._8_4_;
              bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
              local_560._12_4_ = (uint)bVar14 * (int)fVar176 | (uint)!bVar14 * auVar106._12_4_;
              bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
              local_560._16_4_ = (uint)bVar14 * (int)fVar131 | (uint)!bVar14 * auVar106._16_4_;
              bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
              local_560._20_4_ = (uint)bVar14 * (int)fVar133 | (uint)!bVar14 * auVar106._20_4_;
              bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
              local_560._24_4_ = (uint)bVar14 * (int)fVar134 | (uint)!bVar14 * auVar106._24_4_;
              bVar14 = SUB81(uVar71 >> 7,0);
              local_560._28_4_ = (uint)bVar14 * auVar95._28_4_ | (uint)!bVar14 * auVar106._28_4_;
              local_8c0 = auVar108;
            }
            if (local_630 != 0) {
              auVar106 = vsubps_avx(ZEXT1632(auVar86),auVar97);
              auVar87 = vfmadd213ps_fma(auVar106,local_8a0,auVar97);
              uVar137 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x40);
              auVar38._4_4_ = uVar137;
              auVar38._0_4_ = uVar137;
              auVar38._8_4_ = uVar137;
              auVar38._12_4_ = uVar137;
              auVar38._16_4_ = uVar137;
              auVar38._20_4_ = uVar137;
              auVar38._24_4_ = uVar137;
              auVar38._28_4_ = uVar137;
              auVar106 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar87._12_4_ + auVar87._12_4_,
                                                            CONCAT48(auVar87._8_4_ + auVar87._8_4_,
                                                                     CONCAT44(auVar87._4_4_ +
                                                                              auVar87._4_4_,
                                                                              auVar87._0_4_ +
                                                                              auVar87._0_4_)))),
                                         auVar38);
              uVar138 = vcmpps_avx512vl(local_8c0,auVar106,6);
              local_630 = local_630 & (byte)uVar138;
              if (local_630 != 0) {
                auVar148._8_4_ = 0xbf800000;
                auVar148._0_8_ = 0xbf800000bf800000;
                auVar148._12_4_ = 0xbf800000;
                auVar148._16_4_ = 0xbf800000;
                auVar148._20_4_ = 0xbf800000;
                auVar148._24_4_ = 0xbf800000;
                auVar148._28_4_ = 0xbf800000;
                auVar39._8_4_ = 0x40000000;
                auVar39._0_8_ = 0x4000000040000000;
                auVar39._12_4_ = 0x40000000;
                auVar39._16_4_ = 0x40000000;
                auVar39._20_4_ = 0x40000000;
                auVar39._24_4_ = 0x40000000;
                auVar39._28_4_ = 0x40000000;
                local_6c0 = vfmadd132ps_avx512vl(local_560,auVar148,auVar39);
                local_560 = local_6c0;
                auVar106 = local_560;
                local_680 = (undefined4)lVar79;
                local_670 = local_950._0_8_;
                uStack_668 = local_950._8_8_;
                local_660 = local_7a0._0_8_;
                uStack_658 = local_7a0._8_8_;
                local_650 = local_7b0._0_8_;
                uStack_648 = local_7b0._8_8_;
                local_640 = local_790._0_8_;
                uStack_638 = local_790._8_8_;
                pGVar9 = (context->scene->geometries).items[uVar78].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                  bVar73 = 0;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (bVar73 = 1, pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_400 = vmovdqa64_avx512vl(auVar204._0_32_);
                  auVar87 = vcvtsi2ss_avx512f(auVar101._0_16_,local_680);
                  fVar167 = auVar87._0_4_;
                  local_620[0] = (fVar167 + local_8a0._0_4_ + 0.0) * (float)local_700;
                  local_620[1] = (fVar167 + local_8a0._4_4_ + 1.0) * local_700._4_4_;
                  local_620[2] = (fVar167 + local_8a0._8_4_ + 2.0) * fStack_6f8;
                  local_620[3] = (fVar167 + local_8a0._12_4_ + 3.0) * fStack_6f4;
                  fStack_610 = (fVar167 + local_8a0._16_4_ + 4.0) * fStack_6f0;
                  fStack_60c = (fVar167 + local_8a0._20_4_ + 5.0) * fStack_6ec;
                  fStack_608 = (fVar167 + local_8a0._24_4_ + 6.0) * fStack_6e8;
                  fStack_604 = fVar167 + local_8a0._28_4_ + 7.0;
                  local_560._0_8_ = local_6c0._0_8_;
                  local_560._8_8_ = local_6c0._8_8_;
                  local_560._16_8_ = local_6c0._16_8_;
                  local_560._24_8_ = local_6c0._24_8_;
                  local_600 = local_560._0_8_;
                  uStack_5f8 = local_560._8_8_;
                  uStack_5f0 = local_560._16_8_;
                  uStack_5e8 = local_560._24_8_;
                  local_5e0 = local_8c0;
                  local_8e0 = local_7a0._0_8_;
                  uStack_8d8 = local_7a0._8_8_;
                  uVar71 = 0;
                  uVar75 = (ulong)local_630;
                  for (uVar76 = uVar75; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000
                      ) {
                    uVar71 = uVar71 + 1;
                  }
                  local_8f0 = local_7b0._0_4_;
                  fStack_8ec = local_7b0._4_4_;
                  fStack_8e8 = local_7b0._8_4_;
                  fStack_8e4 = local_7b0._12_4_;
                  _local_970 = local_790;
                  local_500._0_4_ = 1;
                  local_6e0 = local_8a0;
                  local_6a0 = local_8c0;
                  local_67c = iVar8;
                  local_560 = auVar106;
                  do {
                    local_960 = *(undefined4 *)(ray + k * 4 + 0x200);
                    local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_620[uVar71]));
                    local_1c0 = vbroadcastss_avx512f
                                          (ZEXT416(*(uint *)((long)&local_600 + uVar71 * 4)));
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_5e0 + uVar71 * 4);
                    local_9a0.context = context->user;
                    fVar176 = local_200._0_4_;
                    fVar174 = 1.0 - fVar176;
                    fVar167 = fVar174 * fVar174 * -3.0;
                    auVar87 = vfmadd231ss_fma(ZEXT416((uint)(fVar174 * fVar174)),
                                              ZEXT416((uint)(fVar176 * fVar174)),ZEXT416(0xc0000000)
                                             );
                    auVar86 = vfmsub132ss_fma(ZEXT416((uint)(fVar176 * fVar174)),
                                              ZEXT416((uint)(fVar176 * fVar176)),ZEXT416(0x40000000)
                                             );
                    fVar174 = auVar87._0_4_ * 3.0;
                    fVar175 = auVar86._0_4_ * 3.0;
                    fVar176 = fVar176 * fVar176 * 3.0;
                    auVar181._0_4_ = fVar176 * (float)local_970._0_4_;
                    auVar181._4_4_ = fVar176 * (float)local_970._4_4_;
                    auVar181._8_4_ = fVar176 * fStack_968;
                    auVar181._12_4_ = fVar176 * fStack_964;
                    auVar145._4_4_ = fVar175;
                    auVar145._0_4_ = fVar175;
                    auVar145._8_4_ = fVar175;
                    auVar145._12_4_ = fVar175;
                    auVar66._4_4_ = fStack_8ec;
                    auVar66._0_4_ = local_8f0;
                    auVar66._8_4_ = fStack_8e8;
                    auVar66._12_4_ = fStack_8e4;
                    auVar87 = vfmadd132ps_fma(auVar145,auVar181,auVar66);
                    auVar164._4_4_ = fVar174;
                    auVar164._0_4_ = fVar174;
                    auVar164._8_4_ = fVar174;
                    auVar164._12_4_ = fVar174;
                    auVar68._8_8_ = uStack_8d8;
                    auVar68._0_8_ = local_8e0;
                    auVar87 = vfmadd132ps_fma(auVar164,auVar87,auVar68);
                    auVar146._4_4_ = fVar167;
                    auVar146._0_4_ = fVar167;
                    auVar146._8_4_ = fVar167;
                    auVar146._12_4_ = fVar167;
                    auVar87 = vfmadd132ps_fma(auVar146,auVar87,local_950);
                    auVar149 = vbroadcastss_avx512f(auVar87);
                    auVar212 = vbroadcastss_avx512f(ZEXT416(1));
                    local_280 = vpermps_avx512f(auVar212,ZEXT1664(auVar87));
                    auVar212 = vbroadcastss_avx512f(ZEXT416(2));
                    local_240 = vpermps_avx512f(auVar212,ZEXT1664(auVar87));
                    local_2c0[0] = (RTCHitN)auVar149[0];
                    local_2c0[1] = (RTCHitN)auVar149[1];
                    local_2c0[2] = (RTCHitN)auVar149[2];
                    local_2c0[3] = (RTCHitN)auVar149[3];
                    local_2c0[4] = (RTCHitN)auVar149[4];
                    local_2c0[5] = (RTCHitN)auVar149[5];
                    local_2c0[6] = (RTCHitN)auVar149[6];
                    local_2c0[7] = (RTCHitN)auVar149[7];
                    local_2c0[8] = (RTCHitN)auVar149[8];
                    local_2c0[9] = (RTCHitN)auVar149[9];
                    local_2c0[10] = (RTCHitN)auVar149[10];
                    local_2c0[0xb] = (RTCHitN)auVar149[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar149[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar149[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar149[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar149[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar149[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar149[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar149[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar149[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar149[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar149[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar149[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar149[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar149[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar149[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar149[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar149[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar149[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar149[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar149[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar149[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar149[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar149[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar149[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar149[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar149[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar149[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar149[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar149[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar149[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar149[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar149[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar149[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar149[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar149[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar149[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar149[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar149[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar149[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar149[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar149[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar149[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar149[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar149[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar149[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar149[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar149[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar149[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar149[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar149[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar149[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar149[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar149[0x3f];
                    local_180 = local_440._0_8_;
                    uStack_178 = local_440._8_8_;
                    uStack_170 = local_440._16_8_;
                    uStack_168 = local_440._24_8_;
                    uStack_160 = local_440._32_8_;
                    uStack_158 = local_440._40_8_;
                    uStack_150 = local_440._48_8_;
                    uStack_148 = local_440._56_8_;
                    auVar149 = vmovdqa64_avx512f(local_480);
                    local_140 = vmovdqa64_avx512f(auVar149);
                    vpcmpeqd_avx2(auVar149._0_32_,auVar149._0_32_);
                    local_100 = vbroadcastss_avx512f(ZEXT416((local_9a0.context)->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416((local_9a0.context)->instPrimID[0]));
                    local_5c0 = local_300;
                    local_9a0.valid = (int *)local_5c0;
                    local_9a0.geometryUserPtr = pGVar9->userPtr;
                    local_9a0.hit = local_2c0;
                    local_9a0.N = 0x10;
                    pRVar72 = (RayK<16> *)pGVar9->occlusionFilterN;
                    local_4c0._0_8_ = uVar71;
                    uVar76 = uVar71;
                    local_9a0.ray = (RTCRayN *)ray;
                    if (pRVar72 != (RayK<16> *)0x0) {
                      pRVar72 = (RayK<16> *)(*(code *)pRVar72)(&local_9a0);
                      uVar76 = local_4c0._0_8_;
                    }
                    auVar149 = vmovdqa64_avx512f(local_5c0);
                    uVar138 = vptestmd_avx512f(auVar149,auVar149);
                    if ((short)uVar138 != 0) {
                      p_Var13 = context->args->filter;
                      if ((p_Var13 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var13)(&local_9a0);
                        uVar76 = local_4c0._0_8_;
                      }
                      auVar87 = auVar209._0_16_;
                      auVar149 = vmovdqa64_avx512f(local_5c0);
                      uVar71 = vptestmd_avx512f(auVar149,auVar149);
                      auVar212 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                      bVar14 = (bool)((byte)uVar71 & 1);
                      auVar149._0_4_ =
                           (uint)bVar14 * auVar212._0_4_ |
                           (uint)!bVar14 * *(int *)(local_9a0.ray + 0x200);
                      bVar14 = (bool)((byte)(uVar71 >> 1) & 1);
                      auVar149._4_4_ =
                           (uint)bVar14 * auVar212._4_4_ |
                           (uint)!bVar14 * *(int *)(local_9a0.ray + 0x204);
                      bVar14 = (bool)((byte)(uVar71 >> 2) & 1);
                      auVar149._8_4_ =
                           (uint)bVar14 * auVar212._8_4_ |
                           (uint)!bVar14 * *(int *)(local_9a0.ray + 0x208);
                      bVar14 = (bool)((byte)(uVar71 >> 3) & 1);
                      auVar149._12_4_ =
                           (uint)bVar14 * auVar212._12_4_ |
                           (uint)!bVar14 * *(int *)(local_9a0.ray + 0x20c);
                      bVar14 = (bool)((byte)(uVar71 >> 4) & 1);
                      auVar149._16_4_ =
                           (uint)bVar14 * auVar212._16_4_ |
                           (uint)!bVar14 * *(int *)(local_9a0.ray + 0x210);
                      bVar14 = (bool)((byte)(uVar71 >> 5) & 1);
                      auVar149._20_4_ =
                           (uint)bVar14 * auVar212._20_4_ |
                           (uint)!bVar14 * *(int *)(local_9a0.ray + 0x214);
                      bVar14 = (bool)((byte)(uVar71 >> 6) & 1);
                      auVar149._24_4_ =
                           (uint)bVar14 * auVar212._24_4_ |
                           (uint)!bVar14 * *(int *)(local_9a0.ray + 0x218);
                      bVar14 = (bool)((byte)(uVar71 >> 7) & 1);
                      auVar149._28_4_ =
                           (uint)bVar14 * auVar212._28_4_ |
                           (uint)!bVar14 * *(int *)(local_9a0.ray + 0x21c);
                      bVar14 = (bool)((byte)(uVar71 >> 8) & 1);
                      auVar149._32_4_ =
                           (uint)bVar14 * auVar212._32_4_ |
                           (uint)!bVar14 * *(int *)(local_9a0.ray + 0x220);
                      bVar14 = (bool)((byte)(uVar71 >> 9) & 1);
                      auVar149._36_4_ =
                           (uint)bVar14 * auVar212._36_4_ |
                           (uint)!bVar14 * *(int *)(local_9a0.ray + 0x224);
                      bVar14 = (bool)((byte)(uVar71 >> 10) & 1);
                      auVar149._40_4_ =
                           (uint)bVar14 * auVar212._40_4_ |
                           (uint)!bVar14 * *(int *)(local_9a0.ray + 0x228);
                      bVar14 = (bool)((byte)(uVar71 >> 0xb) & 1);
                      auVar149._44_4_ =
                           (uint)bVar14 * auVar212._44_4_ |
                           (uint)!bVar14 * *(int *)(local_9a0.ray + 0x22c);
                      bVar14 = (bool)((byte)(uVar71 >> 0xc) & 1);
                      auVar149._48_4_ =
                           (uint)bVar14 * auVar212._48_4_ |
                           (uint)!bVar14 * *(int *)(local_9a0.ray + 0x230);
                      bVar14 = (bool)((byte)(uVar71 >> 0xd) & 1);
                      auVar149._52_4_ =
                           (uint)bVar14 * auVar212._52_4_ |
                           (uint)!bVar14 * *(int *)(local_9a0.ray + 0x234);
                      bVar14 = (bool)((byte)(uVar71 >> 0xe) & 1);
                      auVar149._56_4_ =
                           (uint)bVar14 * auVar212._56_4_ |
                           (uint)!bVar14 * *(int *)(local_9a0.ray + 0x238);
                      bVar14 = SUB81(uVar71 >> 0xf,0);
                      auVar149._60_4_ =
                           (uint)bVar14 * auVar212._60_4_ |
                           (uint)!bVar14 * *(int *)(local_9a0.ray + 0x23c);
                      *(undefined1 (*) [64])(local_9a0.ray + 0x200) = auVar149;
                      pRVar72 = (RayK<16> *)local_9a0.ray;
                      if ((short)uVar71 != 0) break;
                    }
                    auVar87 = auVar209._0_16_;
                    *(undefined4 *)(ray + k * 4 + 0x200) = local_960;
                    uVar71 = 0;
                    uVar75 = uVar75 ^ 1L << (uVar76 & 0x3f);
                    for (uVar76 = uVar75; (uVar76 & 1) == 0;
                        uVar76 = uVar76 >> 1 | 0x8000000000000000) {
                      uVar71 = uVar71 + 1;
                    }
                    local_500._0_4_ = (int)CONCAT71((int7)((ulong)pRVar72 >> 8),uVar75 != 0);
                  } while (uVar75 != 0);
                  bVar73 = local_500[0] & 1;
                  auVar87 = vxorps_avx512vl(auVar87,auVar87);
                  auVar209 = ZEXT1664(auVar87);
                  auVar205 = ZEXT3264(local_7e0);
                  auVar206 = ZEXT3264(local_720);
                  auVar207 = ZEXT3264(local_800);
                  auVar213 = ZEXT3264(local_740);
                  auVar210 = ZEXT3264(local_820);
                  auVar211 = ZEXT3264(local_840);
                  auVar149 = ZEXT3264(local_760);
                  auVar212 = ZEXT3264(local_780);
                  auVar106 = vmovdqa64_avx512vl(local_400);
                  auVar204 = ZEXT3264(auVar106);
                }
                bVar77 = (bool)(bVar77 | bVar73);
              }
            }
          }
          lVar79 = lVar79 + 8;
        } while ((int)lVar79 < iVar8);
      }
      if (bVar77 != false) {
        return local_9e1;
      }
      uVar137 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar32._4_4_ = uVar137;
      auVar32._0_4_ = uVar137;
      auVar32._8_4_ = uVar137;
      auVar32._12_4_ = uVar137;
      uVar138 = vcmpps_avx512vl(local_510,auVar32,2);
      uVar78 = (uint)uVar80 & (uint)uVar80 + 0xf & (uint)uVar138;
      uVar80 = (ulong)uVar78;
      local_9e1 = uVar78 != 0;
    } while (local_9e1);
  }
  return local_9e1;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }